

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

void __thiscall
flatbuffers::ts::TsGenerator::GenObjApi
          (TsGenerator *this,Parser *parser,StructDef *struct_def,string *obj_api_unpack_func,
          string *obj_api_class,import_set *imports)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  FieldDef **ppFVar3;
  FieldDef *pFVar4;
  StructDef *pSVar5;
  _Base_ptr p_Var6;
  string *psVar7;
  int iVar8;
  long *plVar9;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  _Var10;
  undefined8 *puVar11;
  size_type *psVar12;
  long *plVar13;
  ulong *puVar14;
  undefined8 *puVar15;
  _Rb_tree_node_base *p_Var16;
  IDLOptions **ppIVar17;
  char *pcVar18;
  pointer pcVar19;
  IDLOptions *pIVar20;
  undefined8 uVar21;
  ulong uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  _Alloc_hider _Var24;
  EnumDef *union_type;
  pointer ppFVar25;
  bool bVar26;
  string field_type_name;
  Type vectortype;
  string vectortypename;
  string field_accessor;
  string field_binded_method;
  string field_field;
  string field_method;
  string constructor_func;
  string field_val;
  string unpack_to_func;
  string field_offset_decl;
  string field_type;
  string struct_name;
  string pack_func_create_call;
  string field_offset_val;
  string pack_func_prototype;
  string unpack_func;
  string pack_func_offset_decl;
  string field_default_val;
  string class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  string local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4e0;
  long local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  IDLOptions **local_4c0;
  long local_4b8;
  IDLOptions *local_4b0;
  long lStack_4a8;
  string local_4a0;
  string local_480;
  bool local_459;
  string local_458;
  string local_438;
  FieldDef *local_418;
  undefined1 local_410 [40];
  undefined1 local_3e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  StructDef *local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0;
  long local_3b8;
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  _Rb_tree_node_base local_390;
  ImportDefinition local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  pointer local_260;
  string local_258;
  byte local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 *local_140;
  undefined8 local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  long *local_a0 [2];
  long local_90 [2];
  string local_80;
  string *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_390._M_left = (_Base_ptr)&this->namer_;
  local_410._32_8_ = this;
  local_390._M_right = (_Base_ptr)imports;
  (*(this->namer_).super_Namer._vptr_Namer
    [(ulong)(((this->super_BaseGenerator).parser_)->opts).generate_object_based_api * 2 + 0xf])
            (&local_50);
  std::operator+(&local_100,"\nunpack(): ",&local_50);
  local_60 = obj_api_unpack_func;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_100);
  paVar23 = &local_230.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_230.field_2._M_allocated_capacity = *psVar12;
    local_230.field_2._8_8_ = plVar9[3];
    local_230._M_dataplus._M_p = (pointer)paVar23;
  }
  else {
    local_230.field_2._M_allocated_capacity = *psVar12;
    local_230._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_230._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_230,(ulong)local_50._M_dataplus._M_p);
  local_1e0 = &local_1d0;
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_1d0 = *plVar13;
    lStack_1c8 = plVar9[3];
  }
  else {
    local_1d0 = *plVar13;
    local_1e0 = (long *)*plVar9;
  }
  local_1d8 = plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_370.name.field_2._M_allocated_capacity = *psVar12;
    local_370.name.field_2._8_8_ = plVar9[3];
  }
  else {
    local_370.name.field_2._M_allocated_capacity = *psVar12;
    local_370.name._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_370.name._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_370);
  local_e0 = &local_d0;
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_d0 = *plVar13;
    lStack_c8 = plVar9[3];
  }
  else {
    local_d0 = *plVar13;
    local_e0 = (long *)*plVar9;
  }
  local_d8 = plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
    operator_delete(local_370.name._M_dataplus._M_p,local_370.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar23) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_230,"\nunpackTo(_o: ",&local_50);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
  puVar14 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_370.name.field_2._M_allocated_capacity = *puVar14;
    local_370.name.field_2._8_8_ = plVar9[3];
  }
  else {
    local_370.name.field_2._M_allocated_capacity = *puVar14;
    local_370.name._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_370.name._M_string_length = plVar9[1];
  *plVar9 = (long)puVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_370);
  local_1e0 = &local_1d0;
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_1d0 = *plVar13;
    lStack_1c8 = plVar9[3];
  }
  else {
    local_1d0 = *plVar13;
    local_1e0 = (long *)*plVar9;
  }
  local_1d8 = plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
    operator_delete(local_370.name._M_dataplus._M_p,local_370.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar23) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (pointer)paVar23;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"constructor(","");
  std::__cxx11::string::append((char *)&local_230);
  local_459 = true;
  if (struct_def->fixed == false) {
    ppFVar25 = (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar3 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (8 < (ulong)((long)ppFVar3 - (long)ppFVar25)) {
      _Var10 = std::
               __find_if<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef*const*,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,__gnu_cxx::__ops::_Iter_negate<flatbuffers::ts::TsGenerator::CanCreateFactoryMethod(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const*)_1_>>
                         (ppFVar25 + 1,ppFVar3);
      local_459 = _Var10._M_current == ppFVar3;
    }
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"\npack(builder:flatbuffers.Builder): flatbuffers.Offset {\n","");
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_140 = &local_130;
  local_138 = 0;
  local_130 = 0;
  AddImport<flatbuffers::StructDef>
            (&local_370,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right,
             &struct_def->super_Definition,struct_def);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  paVar23 = &local_370.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p == paVar23) {
    local_160.field_2._8_8_ = local_370.name.field_2._8_8_;
  }
  else {
    local_160._M_dataplus._M_p = local_370.name._M_dataplus._M_p;
  }
  local_160.field_2._M_allocated_capacity = local_370.name.field_2._M_allocated_capacity;
  local_160._M_string_length = local_370.name._M_string_length;
  local_370.name._M_string_length = 0;
  local_370.name.field_2._M_allocated_capacity =
       local_370.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_370.name._M_dataplus._M_p = (pointer)paVar23;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.object_name._M_dataplus._M_p != &local_370.object_name.field_2) {
    operator_delete(local_370.object_name._M_dataplus._M_p,
                    local_370.object_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.rel_file_path._M_dataplus._M_p != &local_370.rel_file_path.field_2) {
    operator_delete(local_370.rel_file_path._M_dataplus._M_p,
                    local_370.rel_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.bare_file_path._M_dataplus._M_p != &local_370.bare_file_path.field_2) {
    operator_delete(local_370.bare_file_path._M_dataplus._M_p,
                    local_370.bare_file_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.export_statement._M_dataplus._M_p != &local_370.export_statement.field_2) {
    operator_delete(local_370.export_statement._M_dataplus._M_p,
                    local_370.export_statement.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.import_statement._M_dataplus._M_p != &local_370.import_statement.field_2) {
    operator_delete(local_370.import_statement._M_dataplus._M_p,
                    local_370.import_statement.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
    operator_delete(local_370.name._M_dataplus._M_p,local_370.name.field_2._M_allocated_capacity + 1
                   );
  }
  local_58 = obj_api_class;
  if (local_459 == false) {
    std::operator+(&local_2a0,"  ",&local_160);
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
    paVar23 = &local_280.field_2;
    puVar14 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_280.field_2._M_allocated_capacity = *puVar14;
      local_280.field_2._8_8_ = puVar11[3];
      local_280._M_dataplus._M_p = (pointer)paVar23;
    }
    else {
      local_280.field_2._M_allocated_capacity = *puVar14;
      local_280._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_280._M_string_length = puVar11[1];
    *puVar11 = puVar14;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::operator+(&local_210,"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar23) {
      uVar21 = local_280.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_210._M_string_length + local_280._M_string_length) {
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        uVar22 = CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                          local_210.field_2._M_local_buf[0]);
      }
      if (uVar22 < local_210._M_string_length + local_280._M_string_length) goto LAB_00253f91;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_210,0,(char *)0x0,(ulong)local_280._M_dataplus._M_p);
    }
    else {
LAB_00253f91:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_280,(ulong)local_210._M_dataplus._M_p);
    }
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    psVar12 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_258.field_2._M_allocated_capacity = *psVar12;
      local_258.field_2._8_8_ = puVar11[3];
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar12;
      local_258._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_258._M_string_length = puVar11[1];
    *puVar11 = psVar12;
    puVar11[1] = 0;
    *(undefined1 *)psVar12 = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
    paVar1 = &local_370.name.field_2;
    puVar15 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_370.name.field_2._M_allocated_capacity = *puVar15;
      local_370.name.field_2._8_8_ = puVar11[3];
      local_370.name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_370.name.field_2._M_allocated_capacity = *puVar15;
      local_370.name._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_370.name._M_string_length = puVar11[1];
    *puVar11 = puVar15;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_140,(string *)&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_370.name._M_dataplus._M_p,
                      (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                               local_210.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar23) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    uVar21 = local_2a0.field_2._M_allocated_capacity;
    _Var24._M_p = local_2a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) goto LAB_00254333;
  }
  else {
    std::operator+(&local_210,"  return ",&local_160);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_210);
    paVar23 = &local_2a0.field_2;
    puVar14 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_2a0.field_2._M_allocated_capacity = *puVar14;
      local_2a0.field_2._8_8_ = plVar9[3];
      local_2a0._M_dataplus._M_p = (pointer)paVar23;
    }
    else {
      local_2a0.field_2._M_allocated_capacity = *puVar14;
      local_2a0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_2a0._M_string_length = plVar9[1];
    *plVar9 = (long)puVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::operator+(&local_180,"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    uVar21 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar23) {
      uVar21 = local_2a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < (char *)(local_180._M_string_length + local_2a0._M_string_length)) {
      pcVar18 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        pcVar18 = (char *)CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                                   local_180.field_2._M_local_buf[0]);
      }
      if (pcVar18 < (char *)(local_180._M_string_length + local_2a0._M_string_length))
      goto LAB_00253ee7;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_180,0,(char *)0x0,(ulong)local_2a0._M_dataplus._M_p);
    }
    else {
LAB_00253ee7:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_2a0,(ulong)local_180._M_dataplus._M_p);
    }
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    puVar14 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_280.field_2._M_allocated_capacity = *puVar14;
      local_280.field_2._8_8_ = puVar11[3];
    }
    else {
      local_280.field_2._M_allocated_capacity = *puVar14;
      local_280._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_280._M_string_length = puVar11[1];
    *puVar11 = puVar14;
    puVar11[1] = 0;
    *(undefined1 *)puVar14 = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_280);
    psVar12 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_258.field_2._M_allocated_capacity = *psVar12;
      local_258.field_2._8_8_ = puVar11[3];
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar12;
      local_258._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_258._M_string_length = puVar11[1];
    *puVar11 = psVar12;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
    paVar1 = &local_370.name.field_2;
    puVar15 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_370.name.field_2._M_allocated_capacity = *puVar15;
      local_370.name.field_2._8_8_ = puVar11[3];
      local_370.name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_370.name.field_2._M_allocated_capacity = *puVar15;
      local_370.name._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_370.name._M_string_length = puVar11[1];
    *puVar11 = puVar15;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_140,(string *)&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_370.name._M_dataplus._M_p,
                      (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,
                      CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                               local_180.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar23) {
      operator_delete(local_2a0._M_dataplus._M_p,
                      (ulong)(local_2a0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      uVar21 = (char *)CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                                local_210.field_2._M_local_buf[0]);
      _Var24._M_p = local_210._M_dataplus._M_p;
LAB_00254333:
      operator_delete(_Var24._M_p,(ulong)(uVar21 + 1));
    }
  }
  if (struct_def->fixed == true) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"this","");
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,",\n    ","");
    imports = (import_set *)0x0;
    GenStructMemberValueTS
              (&local_258,(TsGenerator *)local_410._32_8_,struct_def,&local_280,&local_2a0,false);
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
    local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
    puVar15 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_370.name.field_2._M_allocated_capacity = *puVar15;
      local_370.name.field_2._8_8_ = puVar11[3];
    }
    else {
      local_370.name.field_2._M_allocated_capacity = *puVar15;
      local_370.name._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_370.name._M_string_length = puVar11[1];
    *puVar11 = puVar15;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_370.name._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
      operator_delete(local_370.name._M_dataplus._M_p,
                      (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,
                      (ulong)(local_2a0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  ppFVar25 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_3c8 = struct_def;
  if (ppFVar25 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_231 = local_459 ^ 1;
    local_1e8 = &local_370.object_name.field_2;
    local_1f0 = &local_370.rel_file_path.field_2;
    do {
      p_Var6 = local_390._M_left;
      pFVar4 = *ppFVar25;
      if (pFVar4->deprecated != false) goto LAB_0025af50;
      local_260 = ppFVar25;
      (**(code **)(*(long *)local_390._M_left + 0x20))(&local_258,local_390._M_left,pFVar4);
      local_418 = pFVar4;
      (**(code **)(*(long *)p_Var6 + 0x90))(&local_280,p_Var6,pFVar4);
      std::operator+(&local_370.name,"this.",&local_258);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_370);
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      puVar14 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_2a0.field_2._M_allocated_capacity = *puVar14;
        local_2a0.field_2._8_8_ = plVar9[3];
      }
      else {
        local_2a0.field_2._M_allocated_capacity = *puVar14;
        local_2a0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_2a0._M_string_length = plVar9[1];
      *plVar9 = (long)puVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
        operator_delete(local_370.name._M_dataplus._M_p,
                        (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
      }
      pFVar4 = local_418;
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      local_210._M_string_length = 0;
      local_210.field_2._M_local_buf[0] = '\0';
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      local_180._M_string_length = 0;
      local_180.field_2._M_local_buf[0] = '\0';
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      local_1c0._M_string_length = 0;
      local_1c0.field_2._M_local_buf[0] = '\0';
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      local_120._M_string_length = 0;
      local_120.field_2._M_local_buf[0] = '\0';
      GenDefaultValue(&local_80,(TsGenerator *)local_410._32_8_,local_418,
                      (import_set *)local_390._M_right);
      ppFVar25 = local_260;
      union_type = (EnumDef *)&pFVar4->value;
      BVar2 = (pFVar4->value).type.base_type;
      if (BVar2 - BASE_TYPE_UTYPE < 0xd) {
        bVar26 = true;
        if (BVar2 != BASE_TYPE_STRING) {
          if (local_418->presence == kOptional) {
            iVar8 = std::__cxx11::string::compare((char *)&(local_418->value).constant);
            bVar26 = iVar8 == 0;
          }
          else {
            bVar26 = false;
          }
        }
        imports = (import_set *)0x0;
        GenTypeName(&local_370.name,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right
                    ,&local_418->super_Definition,(Type *)union_type,false,bVar26);
        std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_370.name._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        (**(code **)(*(long *)local_390._M_left + 0x20))(local_3e8,local_390._M_left,local_418);
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_3e8,0,(char *)0x0,0x36e884);
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_410._16_8_ = *puVar15;
          local_410._24_8_ = puVar11[3];
          local_410._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_410 + 0x10);
        }
        else {
          local_410._16_8_ = *puVar15;
          local_410._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_410._8_8_ = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_410);
        paVar23 = &local_370.name.field_2;
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_370.name.field_2._M_allocated_capacity = *puVar15;
          local_370.name.field_2._8_8_ = puVar11[3];
          local_370.name._M_dataplus._M_p = (pointer)paVar23;
        }
        else {
          local_370.name.field_2._M_allocated_capacity = *puVar15;
          local_370.name._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_370.name._M_string_length = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != paVar23) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
          operator_delete((void *)local_410._0_8_,(ulong)(local_410._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._0_8_ != &local_3d8) {
          operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
        }
        if ((((Value *)union_type)->type).base_type == BASE_TYPE_STRING) {
          (**(code **)(*(long *)local_390._M_left + 0x90))(local_3e8,local_390._M_left,local_418);
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_3e8,0,(char *)0x0,0x36e884);
          local_410._0_8_ = local_410 + 0x10;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_410._16_8_ = *puVar15;
            local_410._24_8_ = puVar11[3];
          }
          else {
            local_410._16_8_ = *puVar15;
            local_410._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_410._8_8_ = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::operator+(&local_520,"builder.createString(this.",&local_280);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_4a0.field_2._M_allocated_capacity = *puVar15;
            local_4a0.field_2._8_8_ = puVar11[3];
          }
          else {
            local_4a0.field_2._M_allocated_capacity = *puVar15;
            local_4a0._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_4a0._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"0","");
          GenNullCheckConditional(&local_370.name,(string *)local_410,&local_4a0,&local_500);
          std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,
                            (ulong)(local_520.field_2._M_allocated_capacity + 1));
          }
          if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
            operator_delete((void *)local_410._0_8_,(ulong)(local_410._16_8_ + 1));
          }
          uVar21 = local_3d8._M_allocated_capacity;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._0_8_ != &local_3d8) {
LAB_00255388:
            operator_delete(paVar23,(ulong)&((IDLOptions *)uVar21)->use_flexbuffers);
          }
        }
        else {
          (**(code **)(*(long *)local_390._M_left + 0x90))(local_410,local_390._M_left,local_418);
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_410,0,(char *)0x0,0x36e884);
          paVar23 = &local_370.name.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_370.name.field_2._M_allocated_capacity = *puVar15;
            local_370.name.field_2._8_8_ = puVar11[3];
            local_370.name._M_dataplus._M_p = (pointer)paVar23;
          }
          else {
            local_370.name.field_2._M_allocated_capacity = *puVar15;
            local_370.name._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_370.name._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_120,(string *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != paVar23) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          uVar21 = local_410._16_8_;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_410._0_8_;
          if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) goto LAB_00255388;
        }
        goto LAB_0025a054;
      }
      switch(BVar2) {
      case BASE_TYPE_VECTOR:
        BVar2 = (local_418->value).type.element;
        local_410._8_8_ = (local_418->value).type.struct_def;
        pIVar20 = (IDLOptions *)(local_418->value).type.enum_def;
        local_410._4_4_ = 0;
        local_410._0_4_ = BVar2;
        local_410._24_2_ = (local_418->value).type.fixed_length;
        imports = (import_set *)0x0;
        local_410._16_8_ = pIVar20;
        GenTypeName((string *)local_3e8,(TsGenerator *)local_410._32_8_,
                    (import_set *)local_390._M_right,&local_3c8->super_Definition,(Type *)local_410,
                    false,false);
        std::__cxx11::string::_M_replace
                  ((ulong)&local_180,0,(char *)local_180._M_string_length,0x388ad9);
        if (BVar2 == BASE_TYPE_STRING) {
          std::__cxx11::string::append((char *)&local_180);
          local_4e0 = &local_4d0;
          local_4d0._M_allocated_capacity = 0x2162622e73696874;
          local_4d8 = 8;
          local_4d0._8_8_ = local_4d0._8_8_ & 0xffffffffffffff00;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_4e0);
          ppFVar25 = local_260;
          local_4c0 = &local_4b0;
          ppIVar17 = (IDLOptions **)(plVar9 + 2);
          if ((IDLOptions **)*plVar9 == ppIVar17) {
            local_4b0 = *ppIVar17;
            lStack_4a8 = plVar9[3];
          }
          else {
            local_4b0 = *ppIVar17;
            local_4c0 = (IDLOptions **)*plVar9;
          }
          local_4b8 = plVar9[1];
          *plVar9 = (long)ppIVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_4c0,(ulong)local_2a0._M_dataplus._M_p);
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_500.field_2._M_allocated_capacity = *psVar12;
            local_500.field_2._8_8_ = plVar9[3];
            local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          }
          else {
            local_500.field_2._M_allocated_capacity = *psVar12;
            local_500._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_500._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"Length","");
          IdlNamer::Field(&local_480,(IdlNamer *)local_390._M_left,local_418,&local_458);
          uVar21 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            uVar21 = local_520.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 <
              (IDLOptions *)(local_480._M_string_length + local_520._M_string_length)) {
            uVar21 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
              uVar21 = local_480.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 <
                (IDLOptions *)(local_480._M_string_length + local_520._M_string_length))
            goto LAB_00255fc6;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_480,0,(char *)0x0,(ulong)local_520._M_dataplus._M_p);
          }
          else {
LAB_00255fc6:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_520,(ulong)local_480._M_dataplus._M_p);
          }
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          psVar12 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_4a0.field_2._M_allocated_capacity = *psVar12;
            local_4a0.field_2._8_8_ = puVar11[3];
          }
          else {
            local_4a0.field_2._M_allocated_capacity = *psVar12;
            local_4a0._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_4a0._M_string_length = puVar11[1];
          *puVar11 = psVar12;
          puVar11[1] = 0;
          *(undefined1 *)psVar12 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
          paVar23 = &local_370.name.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_370.name.field_2._M_allocated_capacity = *puVar15;
            local_370.name.field_2._8_8_ = puVar11[3];
            local_370.name._M_dataplus._M_p = (pointer)paVar23;
          }
          else {
            local_370.name.field_2._M_allocated_capacity = *puVar15;
            local_370.name._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_370.name._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != paVar23) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          paVar23 = &local_480.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != paVar23) {
            operator_delete(local_480._M_dataplus._M_p,
                            (ulong)(local_480.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,
                            (ulong)(local_458.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,
                            (ulong)(local_520.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,(ulong)&local_4b0->use_flexbuffers);
          }
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0,local_4d0._M_allocated_capacity + 1);
          }
          AddImport<flatbuffers::StructDef>
                    (&local_370,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right,
                     &local_3c8->super_Definition,local_3c8);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_480.field_2._M_allocated_capacity = *puVar15;
            local_480.field_2._8_8_ = puVar11[3];
            local_480._M_dataplus._M_p = (pointer)paVar23;
          }
          else {
            local_480.field_2._M_allocated_capacity = *puVar15;
            local_480._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_480._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"create","");
          local_3a0._M_allocated_capacity = (size_type)&local_390;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_3b0)->field_2,"Vector","");
          (**(code **)(*(long *)local_390._M_left + 0x10))
                    (&local_458,local_390._M_left,&local_438,local_418,
                     (string *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_3b0)->field_2);
          uVar21 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != paVar23) {
            uVar21 = local_480.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 <
              (IDLOptions *)(local_458._M_string_length + local_480._M_string_length)) {
            uVar21 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
              uVar21 = local_458.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 <
                (IDLOptions *)(local_458._M_string_length + local_480._M_string_length))
            goto LAB_002574b8;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_458,0,(char *)0x0,(ulong)local_480._M_dataplus._M_p);
          }
          else {
LAB_002574b8:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_480,(ulong)local_458._M_dataplus._M_p);
          }
          local_4e0 = &local_4d0;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_4d0._M_allocated_capacity = *puVar15;
            local_4d0._8_8_ = puVar11[3];
          }
          else {
            local_4d0._M_allocated_capacity = *puVar15;
            local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4d8 = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)puVar15 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
          local_4c0 = &local_4b0;
          ppIVar17 = (IDLOptions **)(puVar11 + 2);
          if ((IDLOptions **)*puVar11 == ppIVar17) {
            local_4b0 = *ppIVar17;
            lStack_4a8 = puVar11[3];
          }
          else {
            local_4b0 = *ppIVar17;
            local_4c0 = (IDLOptions **)*puVar11;
          }
          local_4b8 = puVar11[1];
          *puVar11 = ppIVar17;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4c0);
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          puVar14 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_500.field_2._M_allocated_capacity = *puVar14;
            local_500.field_2._8_8_ = puVar11[3];
          }
          else {
            local_500.field_2._M_allocated_capacity = *puVar14;
            local_500._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_500._M_string_length = puVar11[1];
          *puVar11 = puVar14;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          (**(code **)(*(long *)local_390._M_left + 0x90))(&local_3c0,local_390._M_left,local_418);
          uVar21 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            uVar21 = local_500.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < (pointer)(local_3b8 + local_500._M_string_length)) {
            pcVar19 = (pointer)0xf;
            if (local_3c0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0) {
              pcVar19 = (pointer)local_3b0._0_8_;
            }
            if (pcVar19 < (pointer)(local_3b8 + local_500._M_string_length)) goto LAB_0025885f;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_3c0,0,(char *)0x0,(ulong)local_500._M_dataplus._M_p);
          }
          else {
LAB_0025885f:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_500,(ulong)local_3c0);
          }
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)puVar15 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
          goto LAB_00258dd9;
        }
        if (BVar2 != BASE_TYPE_STRUCT) {
          if (BVar2 == BASE_TYPE_UNION) {
            GenObjApiUnionTypeTS
                      (&local_370.name,(TsGenerator *)local_410._32_8_,
                       (import_set *)local_390._M_right,local_3c8,pIVar20,(EnumDef *)imports);
            std::__cxx11::string::_M_append
                      ((char *)&local_180,(ulong)local_370.name._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
            std::__cxx11::string::append((char *)&local_180);
            imports = (import_set *)local_410;
            GenUnionValTS(&local_370.name,(TsGenerator *)local_410._32_8_,
                          (import_set *)local_390._M_right,local_3c8,&local_258,(Type *)imports,true
                         );
            std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
            AddImport<flatbuffers::StructDef>
                      (&local_370,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right,
                       &local_3c8->super_Definition,local_3c8);
            ppFVar25 = local_260;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_480.field_2._M_allocated_capacity = *puVar15;
              local_480.field_2._8_8_ = puVar11[3];
              local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
            }
            else {
              local_480.field_2._M_allocated_capacity = *puVar15;
              local_480._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_480._M_string_length = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"create","");
            local_3a0._M_allocated_capacity = (size_type)&local_390;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)
                       &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_3b0)->field_2,"Vector","");
            (**(code **)(*(long *)local_390._M_left + 0x10))
                      (&local_458,local_390._M_left,&local_438,local_418,
                       (string *)
                       &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_3b0)->field_2);
            uVar21 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
              uVar21 = local_480.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 <
                (IDLOptions *)(local_458._M_string_length + local_480._M_string_length)) {
              uVar21 = (IDLOptions *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_458._M_dataplus._M_p != &local_458.field_2) {
                uVar21 = local_458.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar21 <
                  (IDLOptions *)(local_458._M_string_length + local_480._M_string_length))
              goto LAB_002563b3;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_458,0,(char *)0x0,(ulong)local_480._M_dataplus._M_p
                                  );
            }
            else {
LAB_002563b3:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_480,(ulong)local_458._M_dataplus._M_p);
            }
            local_4e0 = &local_4d0;
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_4d0._M_allocated_capacity = *puVar15;
              local_4d0._8_8_ = puVar11[3];
            }
            else {
              local_4d0._M_allocated_capacity = *puVar15;
              local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar11;
            }
            local_4d8 = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)puVar15 = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
            local_4c0 = &local_4b0;
            ppIVar17 = (IDLOptions **)(puVar11 + 2);
            if ((IDLOptions **)*puVar11 == ppIVar17) {
              local_4b0 = *ppIVar17;
              lStack_4a8 = puVar11[3];
            }
            else {
              local_4b0 = *ppIVar17;
              local_4c0 = (IDLOptions **)*puVar11;
            }
            local_4b8 = puVar11[1];
            *puVar11 = ppIVar17;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4c0);
            local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
            puVar14 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_500.field_2._M_allocated_capacity = *puVar14;
              local_500.field_2._8_8_ = puVar11[3];
            }
            else {
              local_500.field_2._M_allocated_capacity = *puVar14;
              local_500._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_500._M_string_length = puVar11[1];
            *puVar11 = puVar14;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            (**(code **)(*(long *)local_390._M_left + 0x90))(&local_3c0,local_390._M_left,local_418)
            ;
            uVar21 = (pointer)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != &local_500.field_2) {
              uVar21 = local_500.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < (pointer)(local_3b8 + local_500._M_string_length)) {
              pcVar19 = (pointer)0xf;
              if (local_3c0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0) {
                pcVar19 = (pointer)local_3b0._0_8_;
              }
              if (pcVar19 < (pointer)(local_3b8 + local_500._M_string_length)) goto LAB_00257b3d;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_3c0,0,(char *)0x0,(ulong)local_500._M_dataplus._M_p
                                  );
            }
            else {
LAB_00257b3d:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_500,(ulong)local_3c0);
            }
            local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_520.field_2._M_allocated_capacity = *puVar15;
              local_520.field_2._8_8_ = puVar11[3];
            }
            else {
              local_520.field_2._M_allocated_capacity = *puVar15;
              local_520._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_520._M_string_length = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)puVar15 = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
            goto LAB_00258dd9;
          }
          if (pIVar20 == (IDLOptions *)0x0) {
            std::__cxx11::string::_M_append((char *)&local_180,local_3e8._0_8_);
          }
          else {
            if (local_418->presence == kOptional) {
              iVar8 = std::__cxx11::string::compare((char *)&(local_418->value).constant);
              bVar26 = iVar8 == 0;
            }
            else {
              bVar26 = false;
            }
            imports = (import_set *)0x0;
            GenTypeName(&local_370.name,(TsGenerator *)local_410._32_8_,
                        (import_set *)local_390._M_right,&local_3c8->super_Definition,
                        (Type *)local_410,false,bVar26);
            std::__cxx11::string::_M_append
                      ((char *)&local_180,(ulong)local_370.name._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
          }
          std::__cxx11::string::append((char *)&local_180);
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          local_458.field_2._M_allocated_capacity = 0x2162622e73696874;
          local_458._M_string_length = 8;
          local_458.field_2._8_8_ = local_458.field_2._8_8_ & 0xffffffffffffff00;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_458);
          ppFVar25 = local_260;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_480.field_2._M_allocated_capacity = *puVar15;
            local_480.field_2._8_8_ = puVar11[3];
          }
          else {
            local_480.field_2._M_allocated_capacity = *puVar15;
            local_480._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_480._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_480,local_3e8._0_8_);
          local_4e0 = &local_4d0;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar23) {
            local_4d0._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_4d0._8_8_ = plVar9[3];
          }
          else {
            local_4d0._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar9;
          }
          local_4d8 = plVar9[1];
          *plVar9 = (long)paVar23;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_4e0);
          local_4c0 = &local_4b0;
          ppIVar17 = (IDLOptions **)(plVar9 + 2);
          if ((IDLOptions **)*plVar9 == ppIVar17) {
            local_4b0 = *ppIVar17;
            lStack_4a8 = plVar9[3];
          }
          else {
            local_4b0 = *ppIVar17;
            local_4c0 = (IDLOptions **)*plVar9;
          }
          local_4b8 = plVar9[1];
          *plVar9 = (long)ppIVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_4c0,(ulong)local_2a0._M_dataplus._M_p);
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_500.field_2._M_allocated_capacity = *psVar12;
            local_500.field_2._8_8_ = plVar9[3];
          }
          else {
            local_500.field_2._M_allocated_capacity = *psVar12;
            local_500._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_500._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_3a0._M_allocated_capacity = (size_type)&local_390;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_3b0)->field_2,"Length","");
          (**(code **)(*(long *)local_390._M_left + 0x18))
                    (&local_438,local_390._M_left,local_418,
                     (string *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_3b0)->field_2);
          uVar21 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            uVar21 = local_520.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 <
              (IDLOptions *)(local_438._M_string_length + local_520._M_string_length)) {
            uVar21 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              uVar21 = local_438.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 <
                (IDLOptions *)(local_438._M_string_length + local_520._M_string_length))
            goto LAB_00256e0d;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_438,0,(char *)0x0,(ulong)local_520._M_dataplus._M_p);
          }
          else {
LAB_00256e0d:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_520,(ulong)local_438._M_dataplus._M_p);
          }
          psVar12 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_4a0.field_2._M_allocated_capacity = *psVar12;
            local_4a0.field_2._8_8_ = puVar11[3];
            local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          }
          else {
            local_4a0.field_2._M_allocated_capacity = *psVar12;
            local_4a0._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_4a0._M_string_length = puVar11[1];
          *puVar11 = psVar12;
          puVar11[1] = 0;
          *(undefined1 *)psVar12 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
          paVar23 = &local_370.name.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_370.name.field_2._M_allocated_capacity = *puVar15;
            local_370.name.field_2._8_8_ = puVar11[3];
            local_370.name._M_dataplus._M_p = (pointer)paVar23;
          }
          else {
            local_370.name.field_2._M_allocated_capacity = *puVar15;
            local_370.name._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_370.name._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != paVar23) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p,
                            (ulong)(local_438.field_2._M_allocated_capacity + 1));
          }
          if ((_Rb_tree_node_base *)local_3a0._M_allocated_capacity != &local_390) {
            operator_delete((void *)local_3a0._M_allocated_capacity,local_390._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,
                            (ulong)(local_520.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,(ulong)&local_4b0->use_flexbuffers);
          }
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0,local_4d0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p,
                            (ulong)(local_480.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,
                            (ulong)(local_458.field_2._M_allocated_capacity + 1));
          }
          AddImport<flatbuffers::StructDef>
                    (&local_370,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right,
                     &local_3c8->super_Definition,local_3c8);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
          local_4e0 = &local_4d0;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_4d0._M_allocated_capacity = *puVar15;
            local_4d0._8_8_ = puVar11[3];
          }
          else {
            local_4d0._M_allocated_capacity = *puVar15;
            local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4d8 = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"create","");
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Vector","");
          (**(code **)(*(long *)local_390._M_left + 0x10))
                    (&local_480,local_390._M_left,&local_458,local_418,&local_438);
          uVar21 = (IDLOptions *)0xf;
          if (local_4e0 != &local_4d0) {
            uVar21 = local_4d0._M_allocated_capacity;
          }
          if ((ulong)uVar21 < (IDLOptions *)(local_480._M_string_length + local_4d8)) {
            uVar21 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
              uVar21 = local_480.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < (IDLOptions *)(local_480._M_string_length + local_4d8))
            goto LAB_00257ec0;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_480,0,(char *)0x0,(ulong)local_4e0);
          }
          else {
LAB_00257ec0:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_4e0,(ulong)local_480._M_dataplus._M_p);
          }
          local_4c0 = &local_4b0;
          ppIVar17 = (IDLOptions **)(puVar11 + 2);
          if ((IDLOptions **)*puVar11 == ppIVar17) {
            local_4b0 = *ppIVar17;
            lStack_4a8 = puVar11[3];
          }
          else {
            local_4b0 = *ppIVar17;
            local_4c0 = (IDLOptions **)*puVar11;
          }
          local_4b8 = puVar11[1];
          *puVar11 = ppIVar17;
          puVar11[1] = 0;
          *(undefined1 *)ppIVar17 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4c0);
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          puVar14 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_500.field_2._M_allocated_capacity = *puVar14;
            local_500.field_2._8_8_ = puVar11[3];
          }
          else {
            local_500.field_2._M_allocated_capacity = *puVar14;
            local_500._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_500._M_string_length = puVar11[1];
          *puVar11 = puVar14;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_500,(ulong)local_280._M_dataplus._M_p);
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
LAB_00258b9b:
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_4a0.field_2._M_allocated_capacity = *puVar15;
            local_4a0.field_2._8_8_ = puVar11[3];
            local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          }
          else {
            local_4a0.field_2._M_allocated_capacity = *puVar15;
            local_4a0._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_4a0._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_4a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,
                            (ulong)(local_520.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,(ulong)&local_4b0->use_flexbuffers);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p,
                            (ulong)(local_480.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p,
                            (ulong)(local_438.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,
                            (ulong)(local_458.field_2._M_allocated_capacity + 1));
          }
          uVar21 = local_4d0._M_allocated_capacity;
          _Var24._M_p = (pointer)local_4e0;
          if (local_4e0 != &local_4d0) goto LAB_00258f82;
          goto LAB_00258f8a;
        }
        pSVar5 = (local_418->value).type.struct_def;
        (*(((IdlNamer *)(local_410._32_8_ + 0x80))->super_Namer)._vptr_Namer
          [(ulong)((*(Parser **)(local_410._32_8_ + 8))->opts).generate_object_based_api * 2 + 0xf])
                  (&local_4a0,local_390._M_left,pSVar5);
        std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_4a0._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_180);
        local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0;
        local_3b0._0_8_ = (pointer)0x2162622e73696874;
        local_3b8 = 8;
        local_3b0[8] = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c0);
        local_3a0._M_allocated_capacity = (size_type)&local_390;
        p_Var16 = (_Rb_tree_node_base *)(plVar9 + 2);
        if ((_Rb_tree_node_base *)*plVar9 == p_Var16) {
          local_390._0_8_ = *(undefined8 *)p_Var16;
          local_390._M_parent = (_Base_ptr)plVar9[3];
        }
        else {
          local_390._0_8_ = *(undefined8 *)p_Var16;
          local_3a0._M_allocated_capacity = (size_type)(_Rb_tree_node_base *)*plVar9;
        }
        local_3a0._8_8_ = plVar9[1];
        *plVar9 = (long)p_Var16;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_3b0)->field_2)._M_local_buf,local_3e8._0_8_);
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_438.field_2._M_allocated_capacity = *puVar15;
          local_438.field_2._8_8_ = puVar11[3];
        }
        else {
          local_438.field_2._M_allocated_capacity = *puVar15;
          local_438._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_438._M_string_length = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_438);
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_458.field_2._M_allocated_capacity = *puVar15;
          local_458.field_2._8_8_ = puVar11[3];
        }
        else {
          local_458.field_2._M_allocated_capacity = *puVar15;
          local_458._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_458._M_string_length = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_458,(ulong)local_4a0._M_dataplus._M_p);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_480.field_2._M_allocated_capacity = *psVar12;
          local_480.field_2._8_8_ = plVar9[3];
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
        }
        else {
          local_480.field_2._M_allocated_capacity = *psVar12;
          local_480._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_480._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_480);
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar23) {
          local_4d0._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_4d0._8_8_ = plVar9[3];
          local_4e0 = &local_4d0;
        }
        else {
          local_4d0._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar9;
        }
        local_4d8 = plVar9[1];
        *plVar9 = (long)paVar23;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_4e0,(ulong)local_2a0._M_dataplus._M_p);
        ppIVar17 = (IDLOptions **)(plVar9 + 2);
        if ((IDLOptions **)*plVar9 == ppIVar17) {
          local_4b0 = *ppIVar17;
          lStack_4a8 = plVar9[3];
          local_4c0 = &local_4b0;
        }
        else {
          local_4b0 = *ppIVar17;
          local_4c0 = (IDLOptions **)*plVar9;
        }
        local_4b8 = plVar9[1];
        *plVar9 = (long)ppIVar17;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_4c0);
        puVar14 = (ulong *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_500.field_2._M_allocated_capacity = *puVar14;
          local_500.field_2._8_8_ = plVar9[3];
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        }
        else {
          local_500.field_2._M_allocated_capacity = *puVar14;
          local_500._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_500._M_string_length = plVar9[1];
        *plVar9 = (long)puVar14;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Length","");
        (**(code **)(*(long *)local_390._M_left + 0x18))
                  (&local_1a0,local_390._M_left,local_418,(string *)local_a0);
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          uVar21 = local_500.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_1a0._M_string_length + local_500._M_string_length) {
          uVar21 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            uVar21 = local_1a0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < local_1a0._M_string_length + local_500._M_string_length)
          goto LAB_00256778;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_1a0,0,(char *)0x0,(ulong)local_500._M_dataplus._M_p);
        }
        else {
LAB_00256778:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_500,(ulong)local_1a0._M_dataplus._M_p);
        }
        psVar12 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_520.field_2._M_allocated_capacity = *psVar12;
          local_520.field_2._8_8_ = puVar11[3];
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
        }
        else {
          local_520.field_2._M_allocated_capacity = *psVar12;
          local_520._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_520._M_string_length = puVar11[1];
        *puVar11 = psVar12;
        puVar11[1] = 0;
        *(undefined1 *)psVar12 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
        paVar23 = &local_370.name.field_2;
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_370.name.field_2._M_allocated_capacity = *puVar15;
          local_370.name.field_2._8_8_ = puVar11[3];
          local_370.name._M_dataplus._M_p = (pointer)paVar23;
        }
        else {
          local_370.name.field_2._M_allocated_capacity = *puVar15;
          local_370.name._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_370.name._M_string_length = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != paVar23) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        paVar23 = &local_480.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = local_390._M_left;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if (local_a0[0] != local_90) {
          operator_delete(local_a0[0],local_90[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0,(ulong)&local_4b0->use_flexbuffers);
        }
        if (local_4e0 != &local_4d0) {
          operator_delete(local_4e0,local_4d0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != paVar23) {
          operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,
                          (ulong)(local_458.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,
                          (ulong)(local_438.field_2._M_allocated_capacity + 1));
        }
        if ((_Rb_tree_node_base *)local_3a0._M_allocated_capacity != &local_390) {
          operator_delete((void *)local_3a0._M_allocated_capacity,local_390._0_8_ + 1);
        }
        if (local_3c0 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0) {
          operator_delete(local_3c0,(ulong)(local_3b0._0_8_ + 1));
        }
        if (pSVar5->fixed == true) {
          std::operator+(&local_458,"builder.createStructOffsetList(this.",&local_280);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_458);
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_480.field_2._M_allocated_capacity = *puVar15;
            local_480.field_2._8_8_ = puVar11[3];
            local_480._M_dataplus._M_p = (pointer)paVar23;
          }
          else {
            local_480.field_2._M_allocated_capacity = *puVar15;
            local_480._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_480._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          AddImport<flatbuffers::StructDef>
                    (&local_370,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right,
                     &local_3c8->super_Definition,local_3c8);
          uVar21 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != paVar23) {
            uVar21 = local_480.field_2._M_allocated_capacity;
          }
          pIVar20 = (IDLOptions *)
                    ((long)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_370.name._M_string_length)->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + local_480._M_string_length)
          ;
          if ((ulong)uVar21 < pIVar20) {
            uVar21 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
              uVar21 = local_370.name.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < pIVar20) goto LAB_002592e9;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_370,0,(char *)0x0,(ulong)local_480._M_dataplus._M_p);
          }
          else {
LAB_002592e9:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_480,(ulong)local_370.name._M_dataplus._M_p);
          }
          local_4e0 = &local_4d0;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_4d0._M_allocated_capacity = *puVar15;
            local_4d0._8_8_ = puVar11[3];
          }
          else {
            local_4d0._M_allocated_capacity = *puVar15;
            local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4d8 = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)puVar15 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
          local_4c0 = &local_4b0;
          ppIVar17 = (IDLOptions **)(puVar11 + 2);
          if ((IDLOptions **)*puVar11 == ppIVar17) {
            local_4b0 = *ppIVar17;
            lStack_4a8 = puVar11[3];
          }
          else {
            local_4b0 = *ppIVar17;
            local_4c0 = (IDLOptions **)*puVar11;
          }
          local_4b8 = puVar11[1];
          *puVar11 = ppIVar17;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_3a0._M_allocated_capacity = (size_type)&local_390;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_3b0)->field_2,"start","");
          local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0
          ;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Vector","");
          (**(code **)(*(long *)p_Var6 + 0x10))
                    (&local_438,p_Var6,
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_3b0)->field_2,local_418,(string *)&local_3c0);
          ppFVar25 = local_260;
          pIVar20 = (IDLOptions *)0xf;
          if (local_4c0 != &local_4b0) {
            pIVar20 = local_4b0;
          }
          if (pIVar20 < (IDLOptions *)(local_438._M_string_length + local_4b8)) {
            uVar21 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              uVar21 = local_438.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < (IDLOptions *)(local_438._M_string_length + local_4b8))
            goto LAB_00259760;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_438,0,(char *)0x0,(ulong)local_4c0);
          }
          else {
LAB_00259760:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_4c0,(ulong)local_438._M_dataplus._M_p);
          }
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          puVar14 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_500.field_2._M_allocated_capacity = *puVar14;
            local_500.field_2._8_8_ = puVar11[3];
          }
          else {
            local_500.field_2._M_allocated_capacity = *puVar14;
            local_500._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_500._M_string_length = puVar11[1];
          *puVar11 = puVar14;
          puVar11[1] = 0;
          *(undefined1 *)puVar14 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
          goto LAB_00259dad;
        }
        AddImport<flatbuffers::StructDef>
                  (&local_370,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right,
                   &local_3c8->super_Definition,local_3c8);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_458.field_2._M_allocated_capacity = *puVar15;
          local_458.field_2._8_8_ = puVar11[3];
        }
        else {
          local_458.field_2._M_allocated_capacity = *puVar15;
          local_458._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_458._M_string_length = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_3a0._M_allocated_capacity = (size_type)&local_390;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0)
                    ->field_2,"create","");
        local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Vector","");
        (**(code **)(*(long *)p_Var6 + 0x10))
                  (&local_438,p_Var6,
                   &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0)
                    ->field_2,local_418,(string *)&local_3c0);
        ppFVar25 = local_260;
        uVar21 = (IDLOptions *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          uVar21 = local_458.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < (IDLOptions *)(local_438._M_string_length + local_458._M_string_length))
        {
          uVar21 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            uVar21 = local_438.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 <
              (IDLOptions *)(local_438._M_string_length + local_458._M_string_length))
          goto LAB_00259413;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_438,0,(char *)0x0,(ulong)local_458._M_dataplus._M_p);
        }
        else {
LAB_00259413:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_458,(ulong)local_438._M_dataplus._M_p);
        }
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_480.field_2._M_allocated_capacity = *puVar15;
          local_480.field_2._8_8_ = puVar11[3];
          local_480._M_dataplus._M_p = (pointer)paVar23;
        }
        else {
          local_480.field_2._M_allocated_capacity = *puVar15;
          local_480._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_480._M_string_length = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)puVar15 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_480);
        local_4e0 = &local_4d0;
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_4d0._M_allocated_capacity = *puVar15;
          local_4d0._8_8_ = puVar11[3];
        }
        else {
          local_4d0._M_allocated_capacity = *puVar15;
          local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar11;
        }
        local_4d8 = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
        local_4c0 = &local_4b0;
        ppIVar17 = (IDLOptions **)(puVar11 + 2);
        if ((IDLOptions **)*puVar11 == ppIVar17) {
          local_4b0 = *ppIVar17;
          lStack_4a8 = puVar11[3];
        }
        else {
          local_4b0 = *ppIVar17;
          local_4c0 = (IDLOptions **)*puVar11;
        }
        local_4b8 = puVar11[1];
        *puVar11 = ppIVar17;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_4c0,(ulong)local_280._M_dataplus._M_p);
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        puVar14 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_500.field_2._M_allocated_capacity = *puVar14;
          local_500.field_2._8_8_ = puVar11[3];
        }
        else {
          local_500.field_2._M_allocated_capacity = *puVar14;
          local_500._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_500._M_string_length = puVar11[1];
        *puVar11 = puVar14;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
LAB_00259a82:
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_520.field_2._M_allocated_capacity = *puVar15;
          local_520.field_2._8_8_ = puVar11[3];
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
        }
        else {
          local_520.field_2._M_allocated_capacity = *puVar15;
          local_520._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_520._M_string_length = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_520);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,
                          (ulong)(local_520.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0,(ulong)&local_4b0->use_flexbuffers);
        }
        if (local_4e0 != &local_4d0) {
          operator_delete(local_4e0,(ulong)(local_4d0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p,
                          (ulong)(local_480.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,
                          (ulong)(local_438.field_2._M_allocated_capacity + 1));
        }
        if (local_3c0 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0) {
          operator_delete(local_3c0,(ulong)(local_3b0._0_8_ + 1));
        }
        if ((_Rb_tree_node_base *)local_3a0._M_allocated_capacity != &local_390) {
          operator_delete((void *)local_3a0._M_allocated_capacity,local_390._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,
                          (ulong)(local_458.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.object_name._M_dataplus._M_p != local_1e8) {
          operator_delete(local_370.object_name._M_dataplus._M_p,
                          local_370.object_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.rel_file_path._M_dataplus._M_p != local_1f0) {
          operator_delete(local_370.rel_file_path._M_dataplus._M_p,
                          local_370.rel_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.bare_file_path._M_dataplus._M_p != &local_370.bare_file_path.field_2) {
          operator_delete(local_370.bare_file_path._M_dataplus._M_p,
                          local_370.bare_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.export_statement._M_dataplus._M_p != &local_370.export_statement.field_2) {
          operator_delete(local_370.export_statement._M_dataplus._M_p,
                          local_370.export_statement.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.import_statement._M_dataplus._M_p != &local_370.import_statement.field_2) {
          operator_delete(local_370.import_statement._M_dataplus._M_p,
                          local_370.import_statement.field_2._M_allocated_capacity + 1);
        }
        uVar21 = local_370.name.field_2._M_allocated_capacity;
        _Var24._M_p = local_370.name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) goto LAB_00259ff3;
LAB_00259ffb:
        uVar21 = local_4a0.field_2._M_allocated_capacity;
        _Var24._M_p = local_4a0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) goto LAB_0025a018;
        goto LAB_0025a020;
      case BASE_TYPE_STRUCT:
        pSVar5 = (local_418->value).type.struct_def;
        AddImport<flatbuffers::StructDef>
                  (&local_370,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right,
                   &local_3c8->super_Definition,pSVar5);
        std::__cxx11::string::_M_append
                  ((char *)&local_180,(ulong)local_370.object_name._M_dataplus._M_p);
        union_type = (EnumDef *)imports;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.object_name._M_dataplus._M_p != local_1e8) {
          operator_delete(local_370.object_name._M_dataplus._M_p,
                          local_370.object_name.field_2._M_allocated_capacity + 1);
          union_type = (EnumDef *)imports;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.rel_file_path._M_dataplus._M_p != local_1f0) {
          operator_delete(local_370.rel_file_path._M_dataplus._M_p,
                          local_370.rel_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.bare_file_path._M_dataplus._M_p != &local_370.bare_file_path.field_2) {
          operator_delete(local_370.bare_file_path._M_dataplus._M_p,
                          local_370.bare_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.export_statement._M_dataplus._M_p != &local_370.export_statement.field_2) {
          operator_delete(local_370.export_statement._M_dataplus._M_p,
                          local_370.export_statement.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.import_statement._M_dataplus._M_p != &local_370.import_statement.field_2) {
          operator_delete(local_370.import_statement._M_dataplus._M_p,
                          local_370.import_statement.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        (**(code **)(*(long *)local_390._M_left + 0x20))(local_3e8,local_390._M_left,local_418);
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_3e8,0,(char *)0x0,0x36e884);
        local_410._0_8_ = local_410 + 0x10;
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_410._16_8_ = *puVar15;
          local_410._24_8_ = puVar11[3];
        }
        else {
          local_410._16_8_ = *puVar15;
          local_410._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_410._8_8_ = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_410);
        local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_370.name.field_2._M_allocated_capacity = *puVar15;
          local_370.name.field_2._8_8_ = puVar11[3];
        }
        else {
          local_370.name.field_2._M_allocated_capacity = *puVar15;
          local_370.name._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_370.name._M_string_length = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
          operator_delete((void *)local_410._0_8_,(ulong)(local_410._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._0_8_ != &local_3d8) {
          operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
        }
        local_3e8._0_8_ = &local_3d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3e8,local_370.name._M_dataplus._M_p,
                   (long)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_370.name._M_string_length)->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start +
                   local_370.name._M_dataplus._M_p);
        std::__cxx11::string::append((char *)local_3e8);
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"null","");
        GenNullCheckConditional((string *)local_410,&local_370.name,(string *)local_3e8,&local_4a0);
        std::__cxx11::string::operator=((string *)&local_210,(string *)local_410);
        if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
          operator_delete((void *)local_410._0_8_,(ulong)(local_410._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._0_8_ != &local_3d8) {
          operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3e8,"this.",&local_280);
        std::operator+(&local_520,"this.",&local_280);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
        local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_4a0.field_2._M_allocated_capacity = *puVar15;
          local_4a0.field_2._8_8_ = puVar11[3];
        }
        else {
          local_4a0.field_2._M_allocated_capacity = *puVar15;
          local_4a0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_4a0._M_string_length = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"0","");
        ppFVar25 = local_260;
        GenNullCheckConditional((string *)local_410,(string *)local_3e8,&local_4a0,&local_500);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,
                          (ulong)(local_520.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._0_8_ != &local_3d8) {
          operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
        }
        this_00 = &local_120;
        if (pSVar5->fixed == false) {
          this_00 = &local_1c0;
        }
        std::__cxx11::string::operator=((string *)this_00,(string *)local_410);
        if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
          operator_delete((void *)local_410._0_8_,(ulong)(local_410._16_8_ + 1));
        }
        uVar21 = local_370.name.field_2._M_allocated_capacity;
        _Var24._M_p = local_370.name._M_dataplus._M_p;
        imports = (import_set *)union_type;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
LAB_002557cf:
          operator_delete(_Var24._M_p,(ulong)&((IDLOptions *)uVar21)->use_flexbuffers);
          imports = (import_set *)union_type;
        }
        break;
      case BASE_TYPE_UNION:
        GenObjApiUnionTypeTS
                  (&local_370.name,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right,
                   local_3c8,(IDLOptions *)(local_418->value).type.enum_def,(EnumDef *)imports);
        std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_370.name._M_dataplus._M_p);
        ppFVar25 = local_260;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        GenUnionValTS(&local_370.name,(TsGenerator *)local_410._32_8_,
                      (import_set *)local_390._M_right,local_3c8,&local_258,(Type *)union_type,false
                     );
        std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,"builder.createObjectOffset(this.",&local_280);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_410);
        paVar23 = &local_370.name.field_2;
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_370.name.field_2._M_allocated_capacity = *puVar15;
          local_370.name.field_2._8_8_ = puVar11[3];
          local_370.name._M_dataplus._M_p = (pointer)paVar23;
        }
        else {
          local_370.name.field_2._M_allocated_capacity = *puVar15;
          local_370.name._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_370.name._M_string_length = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != paVar23) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        uVar21 = local_410._16_8_;
        _Var24._M_p = (pointer)local_410._0_8_;
        imports = (import_set *)union_type;
        if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) goto LAB_002557cf;
        break;
      case BASE_TYPE_ARRAY:
        BVar2 = (local_418->value).type.element;
        local_410._8_8_ = (local_418->value).type.struct_def;
        pIVar20 = (IDLOptions *)(local_418->value).type.enum_def;
        local_410._4_4_ = 0;
        local_410._0_4_ = BVar2;
        local_410._24_2_ = (local_418->value).type.fixed_length;
        imports = (import_set *)0x0;
        local_410._16_8_ = pIVar20;
        GenTypeName((string *)local_3e8,(TsGenerator *)local_410._32_8_,
                    (import_set *)local_390._M_right,&local_3c8->super_Definition,(Type *)local_410,
                    false,false);
        std::__cxx11::string::_M_replace
                  ((ulong)&local_180,0,(char *)local_180._M_string_length,0x388ad9);
        if (BVar2 == BASE_TYPE_STRING) {
          std::__cxx11::string::append((char *)&local_180);
          local_4e0 = &local_4d0;
          local_4d0._M_allocated_capacity = 0x2162622e73696874;
          local_4d8 = 8;
          local_4d0._8_8_ = local_4d0._8_8_ & 0xffffffffffffff00;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_4e0);
          ppFVar25 = local_260;
          local_4c0 = &local_4b0;
          ppIVar17 = (IDLOptions **)(plVar9 + 2);
          if ((IDLOptions **)*plVar9 == ppIVar17) {
            local_4b0 = *ppIVar17;
            lStack_4a8 = plVar9[3];
          }
          else {
            local_4b0 = *ppIVar17;
            local_4c0 = (IDLOptions **)*plVar9;
          }
          local_4b8 = plVar9[1];
          *plVar9 = (long)ppIVar17;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_4c0,(ulong)local_2a0._M_dataplus._M_p);
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_500.field_2._M_allocated_capacity = *psVar12;
            local_500.field_2._8_8_ = plVar9[3];
            local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          }
          else {
            local_500.field_2._M_allocated_capacity = *psVar12;
            local_500._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_500._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"Length","");
          IdlNamer::Field(&local_480,(IdlNamer *)local_390._M_left,local_418,&local_458);
          uVar21 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            uVar21 = local_520.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 <
              (IDLOptions *)(local_480._M_string_length + local_520._M_string_length)) {
            uVar21 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
              uVar21 = local_480.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 <
                (IDLOptions *)(local_480._M_string_length + local_520._M_string_length))
            goto LAB_00255ef4;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_480,0,(char *)0x0,(ulong)local_520._M_dataplus._M_p);
          }
          else {
LAB_00255ef4:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_520,(ulong)local_480._M_dataplus._M_p);
          }
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          psVar12 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_4a0.field_2._M_allocated_capacity = *psVar12;
            local_4a0.field_2._8_8_ = puVar11[3];
          }
          else {
            local_4a0.field_2._M_allocated_capacity = *psVar12;
            local_4a0._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_4a0._M_string_length = puVar11[1];
          *puVar11 = psVar12;
          puVar11[1] = 0;
          *(undefined1 *)psVar12 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
          paVar23 = &local_370.name.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_370.name.field_2._M_allocated_capacity = *puVar15;
            local_370.name.field_2._8_8_ = puVar11[3];
            local_370.name._M_dataplus._M_p = (pointer)paVar23;
          }
          else {
            local_370.name.field_2._M_allocated_capacity = *puVar15;
            local_370.name._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_370.name._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != paVar23) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          paVar23 = &local_480.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != paVar23) {
            operator_delete(local_480._M_dataplus._M_p,
                            (ulong)(local_480.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p,
                            (ulong)(local_458.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,
                            (ulong)(local_520.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,(ulong)&local_4b0->use_flexbuffers);
          }
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0,local_4d0._M_allocated_capacity + 1);
          }
          AddImport<flatbuffers::StructDef>
                    (&local_370,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right,
                     &local_3c8->super_Definition,local_3c8);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_480.field_2._M_allocated_capacity = *puVar15;
            local_480.field_2._8_8_ = puVar11[3];
            local_480._M_dataplus._M_p = (pointer)paVar23;
          }
          else {
            local_480.field_2._M_allocated_capacity = *puVar15;
            local_480._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_480._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"create","");
          local_3a0._M_allocated_capacity = (size_type)&local_390;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_3b0)->field_2,"Vector","");
          (**(code **)(*(long *)local_390._M_left + 0x10))
                    (&local_458,local_390._M_left,&local_438,local_418,
                     (string *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_3b0)->field_2);
          uVar21 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != paVar23) {
            uVar21 = local_480.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 <
              (IDLOptions *)(local_458._M_string_length + local_480._M_string_length)) {
            uVar21 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
              uVar21 = local_458.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 <
                (IDLOptions *)(local_458._M_string_length + local_480._M_string_length))
            goto LAB_00257161;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_458,0,(char *)0x0,(ulong)local_480._M_dataplus._M_p);
          }
          else {
LAB_00257161:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_480,(ulong)local_458._M_dataplus._M_p);
          }
          local_4e0 = &local_4d0;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_4d0._M_allocated_capacity = *puVar15;
            local_4d0._8_8_ = puVar11[3];
          }
          else {
            local_4d0._M_allocated_capacity = *puVar15;
            local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4d8 = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)puVar15 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
          local_4c0 = &local_4b0;
          ppIVar17 = (IDLOptions **)(puVar11 + 2);
          if ((IDLOptions **)*puVar11 == ppIVar17) {
            local_4b0 = *ppIVar17;
            lStack_4a8 = puVar11[3];
          }
          else {
            local_4b0 = *ppIVar17;
            local_4c0 = (IDLOptions **)*puVar11;
          }
          local_4b8 = puVar11[1];
          *puVar11 = ppIVar17;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4c0);
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          puVar14 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_500.field_2._M_allocated_capacity = *puVar14;
            local_500.field_2._8_8_ = puVar11[3];
          }
          else {
            local_500.field_2._M_allocated_capacity = *puVar14;
            local_500._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_500._M_string_length = puVar11[1];
          *puVar11 = puVar14;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          (**(code **)(*(long *)local_390._M_left + 0x90))(&local_3c0,local_390._M_left,local_418);
          uVar21 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            uVar21 = local_500.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < (pointer)(local_3b8 + local_500._M_string_length)) {
            pcVar19 = (pointer)0xf;
            if (local_3c0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0) {
              pcVar19 = (pointer)local_3b0._0_8_;
            }
            if (pcVar19 < (pointer)(local_3b8 + local_500._M_string_length)) goto LAB_002586cd;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_3c0,0,(char *)0x0,(ulong)local_500._M_dataplus._M_p);
          }
          else {
LAB_002586cd:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_500,(ulong)local_3c0);
          }
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)puVar15 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
        }
        else {
          if (BVar2 == BASE_TYPE_STRUCT) {
            pSVar5 = (local_418->value).type.struct_def;
            (*(((IdlNamer *)(local_410._32_8_ + 0x80))->super_Namer)._vptr_Namer
              [(ulong)((*(Parser **)(local_410._32_8_ + 8))->opts).generate_object_based_api * 2 +
               0xf])(&local_4a0,local_390._M_left,pSVar5);
            std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_4a0._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&local_180);
            local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_3b0;
            local_3b0._0_8_ = (pointer)0x2162622e73696874;
            local_3b8 = 8;
            local_3b0[8] = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c0);
            local_3a0._M_allocated_capacity = (size_type)&local_390;
            p_Var16 = (_Rb_tree_node_base *)(plVar9 + 2);
            if ((_Rb_tree_node_base *)*plVar9 == p_Var16) {
              local_390._0_8_ = *(undefined8 *)p_Var16;
              local_390._M_parent = (_Base_ptr)plVar9[3];
            }
            else {
              local_390._0_8_ = *(undefined8 *)p_Var16;
              local_3a0._M_allocated_capacity = (size_type)(_Rb_tree_node_base *)*plVar9;
            }
            local_3a0._8_8_ = plVar9[1];
            *plVar9 = (long)p_Var16;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_3b0)->field_2)._M_local_buf,local_3e8._0_8_);
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_438.field_2._M_allocated_capacity = *puVar15;
              local_438.field_2._8_8_ = puVar11[3];
            }
            else {
              local_438.field_2._M_allocated_capacity = *puVar15;
              local_438._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_438._M_string_length = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_438);
            local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_458.field_2._M_allocated_capacity = *puVar15;
              local_458.field_2._8_8_ = puVar11[3];
            }
            else {
              local_458.field_2._M_allocated_capacity = *puVar15;
              local_458._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_458._M_string_length = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_458,(ulong)local_4a0._M_dataplus._M_p);
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_480.field_2._M_allocated_capacity = *psVar12;
              local_480.field_2._8_8_ = plVar9[3];
              local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
            }
            else {
              local_480.field_2._M_allocated_capacity = *psVar12;
              local_480._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_480._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_480);
            paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 == paVar23) {
              local_4d0._M_allocated_capacity = paVar23->_M_allocated_capacity;
              local_4d0._8_8_ = plVar9[3];
              local_4e0 = &local_4d0;
            }
            else {
              local_4d0._M_allocated_capacity = paVar23->_M_allocated_capacity;
              local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar9;
            }
            local_4d8 = plVar9[1];
            *plVar9 = (long)paVar23;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_4e0,(ulong)local_2a0._M_dataplus._M_p);
            ppIVar17 = (IDLOptions **)(plVar9 + 2);
            if ((IDLOptions **)*plVar9 == ppIVar17) {
              local_4b0 = *ppIVar17;
              lStack_4a8 = plVar9[3];
              local_4c0 = &local_4b0;
            }
            else {
              local_4b0 = *ppIVar17;
              local_4c0 = (IDLOptions **)*plVar9;
            }
            local_4b8 = plVar9[1];
            *plVar9 = (long)ppIVar17;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_4c0);
            puVar14 = (ulong *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_500.field_2._M_allocated_capacity = *puVar14;
              local_500.field_2._8_8_ = plVar9[3];
              local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
            }
            else {
              local_500.field_2._M_allocated_capacity = *puVar14;
              local_500._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_500._M_string_length = plVar9[1];
            *plVar9 = (long)puVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            NumToString<unsigned_short>(&local_1a0,(local_418->value).type.fixed_length);
            uVar21 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != &local_500.field_2) {
              uVar21 = local_500.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < local_1a0._M_string_length + local_500._M_string_length) {
              uVar21 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                uVar21 = local_1a0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar21 < local_1a0._M_string_length + local_500._M_string_length)
              goto LAB_002566a3;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_1a0,0,(char *)0x0,(ulong)local_500._M_dataplus._M_p
                                  );
            }
            else {
LAB_002566a3:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_500,(ulong)local_1a0._M_dataplus._M_p);
            }
            psVar12 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_520.field_2._M_allocated_capacity = *psVar12;
              local_520.field_2._8_8_ = puVar11[3];
              local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
            }
            else {
              local_520.field_2._M_allocated_capacity = *psVar12;
              local_520._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_520._M_string_length = puVar11[1];
            *puVar11 = psVar12;
            puVar11[1] = 0;
            *(undefined1 *)psVar12 = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
            paVar23 = &local_370.name.field_2;
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_370.name.field_2._M_allocated_capacity = *puVar15;
              local_370.name.field_2._8_8_ = puVar11[3];
              local_370.name._M_dataplus._M_p = (pointer)paVar23;
            }
            else {
              local_370.name.field_2._M_allocated_capacity = *puVar15;
              local_370.name._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_370.name._M_string_length = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != paVar23) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
            paVar23 = &local_480.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._M_dataplus._M_p != &local_520.field_2) {
              operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1
                             );
            }
            p_Var6 = local_390._M_left;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != &local_500.field_2) {
              operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_4c0 != &local_4b0) {
              operator_delete(local_4c0,(ulong)&local_4b0->use_flexbuffers);
            }
            if (local_4e0 != &local_4d0) {
              operator_delete(local_4e0,local_4d0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != paVar23) {
              operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
              operator_delete(local_458._M_dataplus._M_p,
                              (ulong)(local_458.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p,
                              (ulong)(local_438.field_2._M_allocated_capacity + 1));
            }
            if ((_Rb_tree_node_base *)local_3a0._M_allocated_capacity != &local_390) {
              operator_delete((void *)local_3a0._M_allocated_capacity,local_390._0_8_ + 1);
            }
            if (local_3c0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0) {
              operator_delete(local_3c0,(ulong)(local_3b0._0_8_ + 1));
            }
            if (pSVar5->fixed != true) {
              AddImport<flatbuffers::StructDef>
                        (&local_370,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right
                         ,&local_3c8->super_Definition,local_3c8);
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
              local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
              puVar15 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar15) {
                local_458.field_2._M_allocated_capacity = *puVar15;
                local_458.field_2._8_8_ = puVar11[3];
              }
              else {
                local_458.field_2._M_allocated_capacity = *puVar15;
                local_458._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_458._M_string_length = puVar11[1];
              *puVar11 = puVar15;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              local_3a0._M_allocated_capacity = (size_type)&local_390;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)
                         &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3b0)->field_2,"create","");
              local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3b0;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Vector","");
              (**(code **)(*(long *)p_Var6 + 0x10))
                        (&local_438,p_Var6,
                         &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3b0)->field_2,local_418,(string *)&local_3c0);
              ppFVar25 = local_260;
              uVar21 = (IDLOptions *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_458._M_dataplus._M_p != &local_458.field_2) {
                uVar21 = local_458.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar21 <
                  (IDLOptions *)(local_438._M_string_length + local_458._M_string_length)) {
                uVar21 = (IDLOptions *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_438._M_dataplus._M_p != &local_438.field_2) {
                  uVar21 = local_438.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar21 <
                    (IDLOptions *)(local_438._M_string_length + local_458._M_string_length))
                goto LAB_0025922e;
                puVar11 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_438,0,(char *)0x0,
                                     (ulong)local_458._M_dataplus._M_p);
              }
              else {
LAB_0025922e:
                puVar11 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_458,(ulong)local_438._M_dataplus._M_p);
              }
              puVar15 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar15) {
                local_480.field_2._M_allocated_capacity = *puVar15;
                local_480.field_2._8_8_ = puVar11[3];
                local_480._M_dataplus._M_p = (pointer)paVar23;
              }
              else {
                local_480.field_2._M_allocated_capacity = *puVar15;
                local_480._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_480._M_string_length = puVar11[1];
              *puVar11 = puVar15;
              puVar11[1] = 0;
              *(undefined1 *)puVar15 = 0;
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_480);
              local_4e0 = &local_4d0;
              puVar15 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar15) {
                local_4d0._M_allocated_capacity = *puVar15;
                local_4d0._8_8_ = puVar11[3];
              }
              else {
                local_4d0._M_allocated_capacity = *puVar15;
                local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*puVar11;
              }
              local_4d8 = puVar11[1];
              *puVar11 = puVar15;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
              local_4c0 = &local_4b0;
              ppIVar17 = (IDLOptions **)(puVar11 + 2);
              if ((IDLOptions **)*puVar11 == ppIVar17) {
                local_4b0 = *ppIVar17;
                lStack_4a8 = puVar11[3];
              }
              else {
                local_4b0 = *ppIVar17;
                local_4c0 = (IDLOptions **)*puVar11;
              }
              local_4b8 = puVar11[1];
              *puVar11 = ppIVar17;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_4c0,(ulong)local_280._M_dataplus._M_p);
              local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
              puVar14 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar14) {
                local_500.field_2._M_allocated_capacity = *puVar14;
                local_500.field_2._8_8_ = puVar11[3];
              }
              else {
                local_500.field_2._M_allocated_capacity = *puVar14;
                local_500._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_500._M_string_length = puVar11[1];
              *puVar11 = puVar14;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
              goto LAB_00259a82;
            }
            std::operator+(&local_458,"builder.createStructOffsetList(this.",&local_280);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_458);
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_480.field_2._M_allocated_capacity = *puVar15;
              local_480.field_2._8_8_ = puVar11[3];
              local_480._M_dataplus._M_p = (pointer)paVar23;
            }
            else {
              local_480.field_2._M_allocated_capacity = *puVar15;
              local_480._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_480._M_string_length = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            AddImport<flatbuffers::StructDef>
                      (&local_370,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right,
                       &local_3c8->super_Definition,local_3c8);
            uVar21 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != paVar23) {
              uVar21 = local_480.field_2._M_allocated_capacity;
            }
            pIVar20 = (IDLOptions *)
                      ((long)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_370.name._M_string_length)->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start +
                      local_480._M_string_length);
            if ((ulong)uVar21 < pIVar20) {
              uVar21 = (IDLOptions *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
                uVar21 = local_370.name.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar21 < pIVar20) goto LAB_00259104;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_370,0,(char *)0x0,(ulong)local_480._M_dataplus._M_p
                                  );
            }
            else {
LAB_00259104:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_480,(ulong)local_370.name._M_dataplus._M_p);
            }
            local_4e0 = &local_4d0;
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_4d0._M_allocated_capacity = *puVar15;
              local_4d0._8_8_ = puVar11[3];
            }
            else {
              local_4d0._M_allocated_capacity = *puVar15;
              local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar11;
            }
            local_4d8 = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)puVar15 = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
            local_4c0 = &local_4b0;
            ppIVar17 = (IDLOptions **)(puVar11 + 2);
            if ((IDLOptions **)*puVar11 == ppIVar17) {
              local_4b0 = *ppIVar17;
              lStack_4a8 = puVar11[3];
            }
            else {
              local_4b0 = *ppIVar17;
              local_4c0 = (IDLOptions **)*puVar11;
            }
            local_4b8 = puVar11[1];
            *puVar11 = ppIVar17;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            local_3a0._M_allocated_capacity = (size_type)&local_390;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)
                       &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_3b0)->field_2,"start","");
            local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_3b0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Vector","");
            (**(code **)(*(long *)p_Var6 + 0x10))
                      (&local_438,p_Var6,
                       &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_3b0)->field_2,local_418,(string *)&local_3c0);
            ppFVar25 = local_260;
            pIVar20 = (IDLOptions *)0xf;
            if (local_4c0 != &local_4b0) {
              pIVar20 = local_4b0;
            }
            if (pIVar20 < (IDLOptions *)(local_438._M_string_length + local_4b8)) {
              uVar21 = (IDLOptions *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438._M_dataplus._M_p != &local_438.field_2) {
                uVar21 = local_438.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar21 < (IDLOptions *)(local_438._M_string_length + local_4b8))
              goto LAB_002595bb;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_438,0,(char *)0x0,(ulong)local_4c0);
            }
            else {
LAB_002595bb:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_4c0,(ulong)local_438._M_dataplus._M_p);
            }
            local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
            puVar14 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_500.field_2._M_allocated_capacity = *puVar14;
              local_500.field_2._8_8_ = puVar11[3];
            }
            else {
              local_500.field_2._M_allocated_capacity = *puVar14;
              local_500._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_500._M_string_length = puVar11[1];
            *puVar11 = puVar14;
            puVar11[1] = 0;
            *(undefined1 *)puVar14 = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
LAB_00259dad:
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_520.field_2._M_allocated_capacity = *puVar15;
              local_520.field_2._8_8_ = puVar11[3];
              local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
            }
            else {
              local_520.field_2._M_allocated_capacity = *puVar15;
              local_520._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_520._M_string_length = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_520);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._M_dataplus._M_p != &local_520.field_2) {
              operator_delete(local_520._M_dataplus._M_p,
                              (ulong)(local_520.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != &local_500.field_2) {
              operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p,
                              (ulong)(local_438.field_2._M_allocated_capacity + 1));
            }
            if (local_3c0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0) {
              operator_delete(local_3c0,(ulong)(local_3b0._0_8_ + 1));
            }
            if ((_Rb_tree_node_base *)local_3a0._M_allocated_capacity != &local_390) {
              operator_delete((void *)local_3a0._M_allocated_capacity,local_390._0_8_ + 1);
            }
            if (local_4c0 != &local_4b0) {
              operator_delete(local_4c0,(ulong)&local_4b0->use_flexbuffers);
            }
            if (local_4e0 != &local_4d0) {
              operator_delete(local_4e0,(ulong)(local_4d0._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.object_name._M_dataplus._M_p != local_1e8) {
              operator_delete(local_370.object_name._M_dataplus._M_p,
                              local_370.object_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.rel_file_path._M_dataplus._M_p != local_1f0) {
              operator_delete(local_370.rel_file_path._M_dataplus._M_p,
                              local_370.rel_file_path.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.bare_file_path._M_dataplus._M_p != &local_370.bare_file_path.field_2) {
              operator_delete(local_370.bare_file_path._M_dataplus._M_p,
                              local_370.bare_file_path.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.export_statement._M_dataplus._M_p !=
                &local_370.export_statement.field_2) {
              operator_delete(local_370.export_statement._M_dataplus._M_p,
                              local_370.export_statement.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.import_statement._M_dataplus._M_p !=
                &local_370.import_statement.field_2) {
              operator_delete(local_370.import_statement._M_dataplus._M_p,
                              local_370.import_statement.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
              operator_delete(local_480._M_dataplus._M_p,
                              (ulong)(local_480.field_2._M_allocated_capacity + 1));
            }
            uVar21 = local_458.field_2._M_allocated_capacity;
            _Var24._M_p = local_458._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
LAB_00259ff3:
              operator_delete(_Var24._M_p,(ulong)&((IDLOptions *)uVar21)->use_flexbuffers);
            }
            goto LAB_00259ffb;
          }
          if (BVar2 != BASE_TYPE_UNION) {
            if (pIVar20 == (IDLOptions *)0x0) {
              std::__cxx11::string::_M_append((char *)&local_180,local_3e8._0_8_);
            }
            else {
              if (local_418->presence == kOptional) {
                iVar8 = std::__cxx11::string::compare((char *)&(local_418->value).constant);
                bVar26 = iVar8 == 0;
              }
              else {
                bVar26 = false;
              }
              imports = (import_set *)0x0;
              GenTypeName(&local_370.name,(TsGenerator *)local_410._32_8_,
                          (import_set *)local_390._M_right,&local_3c8->super_Definition,
                          (Type *)local_410,false,bVar26);
              std::__cxx11::string::_M_append
                        ((char *)&local_180,(ulong)local_370.name._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
                operator_delete(local_370.name._M_dataplus._M_p,
                                (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
              }
            }
            std::__cxx11::string::append((char *)&local_180);
            local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
            local_458.field_2._M_allocated_capacity = 0x2162622e73696874;
            local_458._M_string_length = 8;
            local_458.field_2._8_8_ = local_458.field_2._8_8_ & 0xffffffffffffff00;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_458);
            ppFVar25 = local_260;
            local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_480.field_2._M_allocated_capacity = *puVar15;
              local_480.field_2._8_8_ = puVar11[3];
            }
            else {
              local_480.field_2._M_allocated_capacity = *puVar15;
              local_480._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_480._M_string_length = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_480,local_3e8._0_8_);
            local_4e0 = &local_4d0;
            paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 == paVar23) {
              local_4d0._M_allocated_capacity = paVar23->_M_allocated_capacity;
              local_4d0._8_8_ = plVar9[3];
            }
            else {
              local_4d0._M_allocated_capacity = paVar23->_M_allocated_capacity;
              local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar9;
            }
            local_4d8 = plVar9[1];
            *plVar9 = (long)paVar23;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_4e0);
            local_4c0 = &local_4b0;
            ppIVar17 = (IDLOptions **)(plVar9 + 2);
            if ((IDLOptions **)*plVar9 == ppIVar17) {
              local_4b0 = *ppIVar17;
              lStack_4a8 = plVar9[3];
            }
            else {
              local_4b0 = *ppIVar17;
              local_4c0 = (IDLOptions **)*plVar9;
            }
            local_4b8 = plVar9[1];
            *plVar9 = (long)ppIVar17;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_4c0,(ulong)local_2a0._M_dataplus._M_p);
            local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_500.field_2._M_allocated_capacity = *psVar12;
              local_500.field_2._8_8_ = plVar9[3];
            }
            else {
              local_500.field_2._M_allocated_capacity = *psVar12;
              local_500._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_500._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
            local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_520.field_2._M_allocated_capacity = *puVar15;
              local_520.field_2._8_8_ = puVar11[3];
            }
            else {
              local_520.field_2._M_allocated_capacity = *puVar15;
              local_520._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_520._M_string_length = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            NumToString<unsigned_short>(&local_438,(local_418->value).type.fixed_length);
            uVar21 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._M_dataplus._M_p != &local_520.field_2) {
              uVar21 = local_520.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 <
                (IDLOptions *)(local_438._M_string_length + local_520._M_string_length)) {
              uVar21 = (IDLOptions *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_438._M_dataplus._M_p != &local_438.field_2) {
                uVar21 = local_438.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar21 <
                  (IDLOptions *)(local_438._M_string_length + local_520._M_string_length))
              goto LAB_00256aa9;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_438,0,(char *)0x0,(ulong)local_520._M_dataplus._M_p
                                  );
            }
            else {
LAB_00256aa9:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_520,(ulong)local_438._M_dataplus._M_p);
            }
            psVar12 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_4a0.field_2._M_allocated_capacity = *psVar12;
              local_4a0.field_2._8_8_ = puVar11[3];
              local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
            }
            else {
              local_4a0.field_2._M_allocated_capacity = *psVar12;
              local_4a0._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_4a0._M_string_length = puVar11[1];
            *puVar11 = psVar12;
            puVar11[1] = 0;
            *(undefined1 *)psVar12 = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
            paVar23 = &local_370.name.field_2;
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_370.name.field_2._M_allocated_capacity = *puVar15;
              local_370.name.field_2._8_8_ = puVar11[3];
              local_370.name._M_dataplus._M_p = (pointer)paVar23;
            }
            else {
              local_370.name.field_2._M_allocated_capacity = *puVar15;
              local_370.name._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_370.name._M_string_length = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != paVar23) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
              operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p,
                              (ulong)(local_438.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._M_dataplus._M_p != &local_520.field_2) {
              operator_delete(local_520._M_dataplus._M_p,
                              (ulong)(local_520.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != &local_500.field_2) {
              operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_4c0 != &local_4b0) {
              operator_delete(local_4c0,(ulong)&local_4b0->use_flexbuffers);
            }
            if (local_4e0 != &local_4d0) {
              operator_delete(local_4e0,local_4d0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
              operator_delete(local_480._M_dataplus._M_p,
                              (ulong)(local_480.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
              operator_delete(local_458._M_dataplus._M_p,
                              (ulong)(local_458.field_2._M_allocated_capacity + 1));
            }
            AddImport<flatbuffers::StructDef>
                      (&local_370,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right,
                       &local_3c8->super_Definition,local_3c8);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
            local_4e0 = &local_4d0;
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_4d0._M_allocated_capacity = *puVar15;
              local_4d0._8_8_ = puVar11[3];
            }
            else {
              local_4d0._M_allocated_capacity = *puVar15;
              local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar11;
            }
            local_4d8 = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"create","");
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Vector","");
            (**(code **)(*(long *)local_390._M_left + 0x10))
                      (&local_480,local_390._M_left,&local_458,local_418,&local_438);
            uVar21 = (IDLOptions *)0xf;
            if (local_4e0 != &local_4d0) {
              uVar21 = local_4d0._M_allocated_capacity;
            }
            if ((ulong)uVar21 < (IDLOptions *)(local_480._M_string_length + local_4d8)) {
              uVar21 = (IDLOptions *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_480._M_dataplus._M_p != &local_480.field_2) {
                uVar21 = local_480.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar21 < (IDLOptions *)(local_480._M_string_length + local_4d8))
              goto LAB_00257819;
              puVar11 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_480,0,(char *)0x0,(ulong)local_4e0);
            }
            else {
LAB_00257819:
              puVar11 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_4e0,(ulong)local_480._M_dataplus._M_p);
            }
            local_4c0 = &local_4b0;
            ppIVar17 = (IDLOptions **)(puVar11 + 2);
            if ((IDLOptions **)*puVar11 == ppIVar17) {
              local_4b0 = *ppIVar17;
              lStack_4a8 = puVar11[3];
            }
            else {
              local_4b0 = *ppIVar17;
              local_4c0 = (IDLOptions **)*puVar11;
            }
            local_4b8 = puVar11[1];
            *puVar11 = ppIVar17;
            puVar11[1] = 0;
            *(undefined1 *)ppIVar17 = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4c0);
            local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
            puVar14 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_500.field_2._M_allocated_capacity = *puVar14;
              local_500.field_2._8_8_ = puVar11[3];
            }
            else {
              local_500.field_2._M_allocated_capacity = *puVar14;
              local_500._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_500._M_string_length = puVar11[1];
            *puVar11 = puVar14;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_500,(ulong)local_280._M_dataplus._M_p);
            local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_520.field_2._M_allocated_capacity = *puVar15;
              local_520.field_2._8_8_ = puVar11[3];
            }
            else {
              local_520.field_2._M_allocated_capacity = *puVar15;
              local_520._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_520._M_string_length = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
            goto LAB_00258b9b;
          }
          GenObjApiUnionTypeTS
                    (&local_370.name,(TsGenerator *)local_410._32_8_,
                     (import_set *)local_390._M_right,local_3c8,pIVar20,(EnumDef *)imports);
          std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_370.name._M_dataplus._M_p)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::string::append((char *)&local_180);
          imports = (import_set *)local_410;
          GenUnionValTS(&local_370.name,(TsGenerator *)local_410._32_8_,
                        (import_set *)local_390._M_right,local_3c8,&local_258,(Type *)imports,true);
          std::__cxx11::string::operator=((string *)&local_210,(string *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          AddImport<flatbuffers::StructDef>
                    (&local_370,(TsGenerator *)local_410._32_8_,(import_set *)local_390._M_right,
                     &local_3c8->super_Definition,local_3c8);
          ppFVar25 = local_260;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_480.field_2._M_allocated_capacity = *puVar15;
            local_480.field_2._8_8_ = puVar11[3];
            local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          }
          else {
            local_480.field_2._M_allocated_capacity = *puVar15;
            local_480._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_480._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"create","");
          local_3a0._M_allocated_capacity = (size_type)&local_390;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_3b0)->field_2,"Vector","");
          (**(code **)(*(long *)local_390._M_left + 0x10))
                    (&local_458,local_390._M_left,&local_438,local_418,
                     (string *)
                     &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_3b0)->field_2);
          uVar21 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            uVar21 = local_480.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 <
              (IDLOptions *)(local_458._M_string_length + local_480._M_string_length)) {
            uVar21 = (IDLOptions *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
              uVar21 = local_458.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 <
                (IDLOptions *)(local_458._M_string_length + local_480._M_string_length))
            goto LAB_00256299;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_458,0,(char *)0x0,(ulong)local_480._M_dataplus._M_p);
          }
          else {
LAB_00256299:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_480,(ulong)local_458._M_dataplus._M_p);
          }
          local_4e0 = &local_4d0;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_4d0._M_allocated_capacity = *puVar15;
            local_4d0._8_8_ = puVar11[3];
          }
          else {
            local_4d0._M_allocated_capacity = *puVar15;
            local_4e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar11;
          }
          local_4d8 = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)puVar15 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4e0);
          local_4c0 = &local_4b0;
          ppIVar17 = (IDLOptions **)(puVar11 + 2);
          if ((IDLOptions **)*puVar11 == ppIVar17) {
            local_4b0 = *ppIVar17;
            lStack_4a8 = puVar11[3];
          }
          else {
            local_4b0 = *ppIVar17;
            local_4c0 = (IDLOptions **)*puVar11;
          }
          local_4b8 = puVar11[1];
          *puVar11 = ppIVar17;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4c0);
          local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
          puVar14 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_500.field_2._M_allocated_capacity = *puVar14;
            local_500.field_2._8_8_ = puVar11[3];
          }
          else {
            local_500.field_2._M_allocated_capacity = *puVar14;
            local_500._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_500._M_string_length = puVar11[1];
          *puVar11 = puVar14;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          (**(code **)(*(long *)local_390._M_left + 0x90))(&local_3c0,local_390._M_left,local_418);
          uVar21 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            uVar21 = local_500.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < (pointer)(local_3b8 + local_500._M_string_length)) {
            pcVar19 = (pointer)0xf;
            if (local_3c0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0) {
              pcVar19 = (pointer)local_3b0._0_8_;
            }
            if (pcVar19 < (pointer)(local_3b8 + local_500._M_string_length)) goto LAB_002579ab;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_3c0,0,(char *)0x0,(ulong)local_500._M_dataplus._M_p);
          }
          else {
LAB_002579ab:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_500,(ulong)local_3c0);
          }
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)puVar15 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
        }
LAB_00258dd9:
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_4a0.field_2._M_allocated_capacity = *puVar15;
          local_4a0.field_2._8_8_ = puVar11[3];
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
        }
        else {
          local_4a0.field_2._M_allocated_capacity = *puVar15;
          local_4a0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_4a0._M_string_length = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_4a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,
                          (ulong)(local_520.field_2._M_allocated_capacity + 1));
        }
        if (local_3c0 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0) {
          operator_delete(local_3c0,(ulong)(local_3b0._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        if (local_4c0 != &local_4b0) {
          operator_delete(local_4c0,(ulong)&local_4b0->use_flexbuffers);
        }
        if (local_4e0 != &local_4d0) {
          operator_delete(local_4e0,(ulong)(local_4d0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,
                          (ulong)(local_458.field_2._M_allocated_capacity + 1));
        }
        if ((_Rb_tree_node_base *)local_3a0._M_allocated_capacity != &local_390) {
          operator_delete((void *)local_3a0._M_allocated_capacity,local_390._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,
                          (ulong)(local_438.field_2._M_allocated_capacity + 1));
        }
        uVar21 = local_480.field_2._M_allocated_capacity;
        _Var24._M_p = local_480._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
LAB_00258f82:
          operator_delete(_Var24._M_p,(ulong)&((IDLOptions *)uVar21)->use_flexbuffers);
        }
LAB_00258f8a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.object_name._M_dataplus._M_p != local_1e8) {
          operator_delete(local_370.object_name._M_dataplus._M_p,
                          local_370.object_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.rel_file_path._M_dataplus._M_p != local_1f0) {
          operator_delete(local_370.rel_file_path._M_dataplus._M_p,
                          local_370.rel_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.bare_file_path._M_dataplus._M_p != &local_370.bare_file_path.field_2) {
          operator_delete(local_370.bare_file_path._M_dataplus._M_p,
                          local_370.bare_file_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.export_statement._M_dataplus._M_p != &local_370.export_statement.field_2) {
          operator_delete(local_370.export_statement._M_dataplus._M_p,
                          local_370.export_statement.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.import_statement._M_dataplus._M_p != &local_370.import_statement.field_2) {
          operator_delete(local_370.import_statement._M_dataplus._M_p,
                          local_370.import_statement.field_2._M_allocated_capacity + 1);
        }
        uVar21 = local_370.name.field_2._M_allocated_capacity;
        _Var24._M_p = local_370.name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
LAB_0025a018:
          operator_delete(_Var24._M_p,(ulong)&((IDLOptions *)uVar21)->use_flexbuffers);
        }
LAB_0025a020:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._0_8_ != &local_3d8) {
          operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_ts.cpp"
                      ,0x5ac,
                      "void flatbuffers::ts::TsGenerator::GenObjApi(const Parser &, StructDef &, std::string &, std::string &, import_set &)"
                     );
      }
      std::__cxx11::string::append((char *)&local_180);
LAB_0025a054:
      if (local_1c0._M_string_length != 0) {
        std::operator+(&local_4a0,"  const ",&local_280);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
        local_3e8._0_8_ = &local_3d8;
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_3d8._M_allocated_capacity = *puVar15;
          local_3d8._8_8_ = puVar11[3];
        }
        else {
          local_3d8._M_allocated_capacity = *puVar15;
          local_3e8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_3e8._8_8_ = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append(local_3e8,(ulong)local_1c0._M_dataplus._M_p);
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_410._16_8_ = *puVar15;
          local_410._24_8_ = puVar11[3];
          local_410._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_410 + 0x10);
        }
        else {
          local_410._16_8_ = *puVar15;
          local_410._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_410._8_8_ = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_410);
        paVar23 = &local_370.name.field_2;
        puVar15 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_370.name.field_2._M_allocated_capacity = *puVar15;
          local_370.name.field_2._8_8_ = puVar11[3];
          local_370.name._M_dataplus._M_p = (pointer)paVar23;
        }
        else {
          local_370.name.field_2._M_allocated_capacity = *puVar15;
          local_370.name._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_370.name._M_string_length = puVar11[1];
        *puVar11 = puVar15;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_370);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.name._M_dataplus._M_p != paVar23) {
          operator_delete(local_370.name._M_dataplus._M_p,
                          (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
          operator_delete((void *)local_410._0_8_,(ulong)(local_410._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._0_8_ != &local_3d8) {
          operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,
                          (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
        }
      }
      if (local_120._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&local_120);
      }
      std::operator+(&local_370.name,"    ",&local_210);
      std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_370.name._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
        operator_delete(local_370.name._M_dataplus._M_p,
                        (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
      }
      std::operator+(&local_4a0,"  _o.",&local_280);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_4a0);
      local_3e8._0_8_ = &local_3d8;
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 == paVar23) {
        local_3d8._M_allocated_capacity = paVar23->_M_allocated_capacity;
        local_3d8._8_8_ = plVar9[3];
      }
      else {
        local_3d8._M_allocated_capacity = paVar23->_M_allocated_capacity;
        local_3e8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar9;
      }
      local_3e8._8_8_ = plVar9[1];
      *plVar9 = (long)paVar23;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append(local_3e8,(ulong)local_210._M_dataplus._M_p);
      local_410._0_8_ = local_410 + 0x10;
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_410._16_8_ = *plVar13;
        local_410._24_8_ = plVar9[3];
      }
      else {
        local_410._16_8_ = *plVar13;
        local_410._0_8_ = (long *)*plVar9;
      }
      local_410._8_8_ = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append(local_410);
      local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_370.name.field_2._M_allocated_capacity = *psVar12;
        local_370.name.field_2._8_8_ = plVar9[3];
      }
      else {
        local_370.name.field_2._M_allocated_capacity = *psVar12;
        local_370.name._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_370.name._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_370.name._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
        operator_delete(local_370.name._M_dataplus._M_p,
                        local_370.name.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
        operator_delete((void *)local_410._0_8_,(ulong)(local_410._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._0_8_ != &local_3d8) {
        operator_delete((void *)local_3e8._0_8_,local_3d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,
                        (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
      }
      std::operator+(&local_520,"  public ",&local_280);
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_520);
      local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
      puVar15 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_4a0.field_2._M_allocated_capacity = *puVar15;
        local_4a0.field_2._8_8_ = puVar11[3];
      }
      else {
        local_4a0.field_2._M_allocated_capacity = *puVar15;
        local_4a0._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_4a0._M_string_length = puVar11[1];
      *puVar11 = puVar15;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_4a0,(ulong)local_180._M_dataplus._M_p);
      local_3e8._0_8_ = &local_3d8;
      puVar15 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_3d8._M_allocated_capacity = *puVar15;
        local_3d8._8_8_ = puVar11[3];
      }
      else {
        local_3d8._M_allocated_capacity = *puVar15;
        local_3e8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar11;
      }
      local_3e8._8_8_ = puVar11[1];
      *puVar11 = puVar15;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)std::__cxx11::string::append(local_3e8);
      local_410._0_8_ = local_410 + 0x10;
      puVar15 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_410._16_8_ = *puVar15;
        local_410._24_8_ = puVar11[3];
      }
      else {
        local_410._16_8_ = *puVar15;
        local_410._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar11;
      }
      local_410._8_8_ = puVar11[1];
      *puVar11 = puVar15;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append(local_410,(ulong)local_80._M_dataplus._M_p);
      local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
      puVar15 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_370.name.field_2._M_allocated_capacity = *puVar15;
        local_370.name.field_2._8_8_ = puVar11[3];
      }
      else {
        local_370.name.field_2._M_allocated_capacity = *puVar15;
        local_370.name._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_370.name._M_string_length = puVar11[1];
      *puVar11 = puVar15;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_370.name._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
        operator_delete(local_370.name._M_dataplus._M_p,
                        (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
      }
      if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
        operator_delete((void *)local_410._0_8_,(ulong)(local_410._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._0_8_ != &local_3d8) {
        operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,
                        (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_dataplus._M_p != &local_520.field_2) {
        operator_delete(local_520._M_dataplus._M_p,
                        (ulong)(local_520.field_2._M_allocated_capacity + 1));
      }
      if (local_3c8->fixed == false) {
        if (local_1c0._M_string_length != 0) {
          local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_370,local_1c0._M_dataplus._M_p,
                     local_1c0._M_dataplus._M_p + local_1c0._M_string_length);
          std::__cxx11::string::append((char *)&local_370);
          std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_370.name._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
        }
        if (local_459 == false) {
          if (((local_418->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
             (local_418->presence == kOptional)) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_410,"  if (",&local_120);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)local_410);
            local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
            puVar15 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_370.name.field_2._M_allocated_capacity = *puVar15;
              local_370.name.field_2._8_8_ = puVar11[3];
            }
            else {
              local_370.name.field_2._M_allocated_capacity = *puVar15;
              local_370.name._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_370.name._M_string_length = puVar11[1];
            *puVar11 = puVar15;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&local_140,(ulong)local_370.name._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
              operator_delete(local_370.name._M_dataplus._M_p,
                              (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
            }
            if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
              operator_delete((void *)local_410._0_8_,(ulong)(local_410._16_8_ + 1));
            }
          }
          std::operator+(&local_500,"  ",&local_160);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_500);
          local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520.field_2._8_8_ = puVar11[3];
          }
          else {
            local_520.field_2._M_allocated_capacity = *puVar15;
            local_520._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_520._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          local_4e0 = &local_4d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"add","");
          (**(code **)(*(long *)local_390._M_left + 0x18))
                    (&local_4c0,local_390._M_left,(string *)&local_4e0,local_418);
          uVar21 = (IDLOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            uVar21 = local_520.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < (IDLOptions *)(local_4b8 + local_520._M_string_length)) {
            pIVar20 = (IDLOptions *)0xf;
            if (local_4c0 != &local_4b0) {
              pIVar20 = local_4b0;
            }
            if (pIVar20 < (IDLOptions *)(local_4b8 + local_520._M_string_length)) goto LAB_0025aa58;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_4c0,0,(char *)0x0,(ulong)local_520._M_dataplus._M_p);
          }
          else {
LAB_0025aa58:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_520,(ulong)local_4c0);
          }
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_4a0.field_2._M_allocated_capacity = *puVar15;
            local_4a0.field_2._8_8_ = puVar11[3];
          }
          else {
            local_4a0.field_2._M_allocated_capacity = *puVar15;
            local_4a0._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_4a0._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)puVar15 = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a0);
          local_3e8._0_8_ = &local_3d8;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_3d8._M_allocated_capacity = *puVar15;
            local_3d8._8_8_ = puVar11[3];
          }
          else {
            local_3d8._M_allocated_capacity = *puVar15;
            local_3e8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_3e8._8_8_ = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append(local_3e8,(ulong)local_120._M_dataplus._M_p);
          local_410._0_8_ = local_410 + 0x10;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_410._16_8_ = *puVar15;
            local_410._24_8_ = puVar11[3];
          }
          else {
            local_410._16_8_ = *puVar15;
            local_410._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar11;
          }
          local_410._8_8_ = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append(local_410);
          local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
          puVar15 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_370.name.field_2._M_allocated_capacity = *puVar15;
            local_370.name.field_2._8_8_ = puVar11[3];
          }
          else {
            local_370.name.field_2._M_allocated_capacity = *puVar15;
            local_370.name._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_370.name._M_string_length = puVar11[1];
          *puVar11 = puVar15;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_370.name._M_dataplus._M_p)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
            operator_delete(local_370.name._M_dataplus._M_p,
                            (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
          }
          if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
            operator_delete((void *)local_410._0_8_,(ulong)(local_410._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._0_8_ != &local_3d8) {
            operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p,
                            (ulong)(local_4a0.field_2._M_allocated_capacity + 1));
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,(ulong)&local_4b0->use_flexbuffers);
          }
          if (local_4e0 != &local_4d0) {
            operator_delete(local_4e0,(ulong)(local_4d0._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_520._M_dataplus._M_p != &local_520.field_2) {
            operator_delete(local_520._M_dataplus._M_p,
                            (ulong)(local_520.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_120._M_dataplus._M_p);
        }
      }
      if (ppFVar25 + 1 ==
          (local_3c8->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::append((char *)&local_230);
        if (local_3c8->fixed == false) {
          std::__cxx11::string::append((char *)&local_c0);
          std::__cxx11::string::append((char *)&local_140);
        }
      }
      else {
        std::__cxx11::string::append((char *)&local_230);
        if (local_3c8->fixed == false && local_231 == 0) {
          std::__cxx11::string::append((char *)&local_140);
        }
      }
      std::__cxx11::string::append((char *)&local_e0);
      std::__cxx11::string::append((char *)&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,
                        CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                 local_120.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,
                        CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                                 local_1c0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,
                        CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                                 local_180.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,
                        CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                                 local_210.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,
                        (ulong)(local_2a0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
LAB_0025af50:
      ppFVar25 = ppFVar25 + 1;
    } while (ppFVar25 !=
             (local_3c8->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::append((char *)&local_230);
  psVar7 = local_58;
  p_Var6 = local_390._M_left;
  pSVar5 = local_3c8;
  if (local_459 != false) {
    std::__cxx11::string::append((char *)&local_140);
    goto LAB_0025b24a;
  }
  std::operator+(&local_2a0,"return ",&local_160);
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a0);
  paVar23 = &local_280.field_2;
  puVar14 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_280.field_2._M_allocated_capacity = *puVar14;
    local_280.field_2._8_8_ = puVar11[3];
    local_280._M_dataplus._M_p = (pointer)paVar23;
  }
  else {
    local_280.field_2._M_allocated_capacity = *puVar14;
    local_280._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_280._M_string_length = puVar11[1];
  *puVar11 = puVar14;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  std::operator+(&local_210,"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar5);
  uVar21 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar23) {
    uVar21 = local_280.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < local_210._M_string_length + local_280._M_string_length) {
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      uVar22 = CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                        local_210.field_2._M_local_buf[0]);
    }
    if (uVar22 < local_210._M_string_length + local_280._M_string_length) goto LAB_0025b0a4;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_210,0,(char *)0x0,(ulong)local_280._M_dataplus._M_p);
  }
  else {
LAB_0025b0a4:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_210._M_dataplus._M_p);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  psVar12 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_258.field_2._M_allocated_capacity = *psVar12;
    local_258.field_2._8_8_ = puVar11[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar12;
    local_258._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_258._M_string_length = puVar11[1];
  *puVar11 = psVar12;
  puVar11[1] = 0;
  *(undefined1 *)psVar12 = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
  local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
  puVar15 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_370.name.field_2._M_allocated_capacity = *puVar15;
    local_370.name.field_2._8_8_ = puVar11[3];
  }
  else {
    local_370.name.field_2._M_allocated_capacity = *puVar15;
    local_370.name._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_370.name._M_string_length = puVar11[1];
  *puVar11 = puVar15;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_370.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
    operator_delete(local_370.name._M_dataplus._M_p,
                    (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,
                    CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                             local_210.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar23) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,(ulong)(local_2a0.field_2._M_allocated_capacity + 1))
    ;
  }
LAB_0025b24a:
  std::__cxx11::string::_M_replace((ulong)psVar7,0,(char *)psVar7->_M_string_length,0x375f09);
  std::__cxx11::string::append((char *)psVar7);
  (*(((IdlNamer *)(local_410._32_8_ + 0x80))->super_Namer)._vptr_Namer
    [(ulong)((*(Parser **)(local_410._32_8_ + 8))->opts).generate_object_based_api * 2 + 0xf])
            (&local_370,p_Var6,pSVar5);
  std::__cxx11::string::_M_append((char *)psVar7,(ulong)local_370.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
    operator_delete(local_370.name._M_dataplus._M_p,
                    (ulong)(local_370.name.field_2._M_allocated_capacity + 1));
  }
  std::__cxx11::string::append((char *)psVar7);
  std::__cxx11::string::_M_append((char *)psVar7,(ulong)local_230._M_dataplus._M_p);
  std::operator+(&local_280,&local_100,&local_c0);
  plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_140);
  paVar23 = &local_258.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_258.field_2._M_allocated_capacity = *psVar12;
    local_258.field_2._8_8_ = plVar9[3];
    local_258._M_dataplus._M_p = (pointer)paVar23;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar12;
    local_258._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_258._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_370.name._M_dataplus._M_p = (pointer)&local_370.name.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_370.name.field_2._M_allocated_capacity = *psVar12;
    local_370.name.field_2._8_8_ = plVar9[3];
  }
  else {
    local_370.name.field_2._M_allocated_capacity = *psVar12;
    local_370.name._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_370.name._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::_M_append((char *)psVar7,(ulong)local_370.name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != &local_370.name.field_2) {
    operator_delete(local_370.name._M_dataplus._M_p,local_370.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar23) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)psVar7);
  std::__cxx11::string::append((char *)&local_e0);
  std::__cxx11::string::append((char *)&local_1e0);
  local_258._M_dataplus._M_p = (pointer)paVar23;
  std::__cxx11::string::_M_construct<char*>((string *)&local_258,local_e0,local_d8 + (long)local_e0)
  ;
  std::__cxx11::string::append((char *)&local_258);
  plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_1e0);
  paVar1 = &local_370.name.field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_370.name.field_2._M_allocated_capacity = *psVar12;
    local_370.name.field_2._8_8_ = plVar9[3];
    local_370.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_370.name.field_2._M_allocated_capacity = *psVar12;
    local_370.name._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_370.name._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::operator=((string *)local_60,(string *)&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_370.name._M_dataplus._M_p,local_370.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar23) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenObjApi(const Parser &parser, StructDef &struct_def,
                 std::string &obj_api_unpack_func, std::string &obj_api_class,
                 import_set &imports) {
    const auto class_name = GetTypeName(struct_def, /*object_api=*/true);

    std::string unpack_func = "\nunpack(): " + class_name +
                              " {\n  return new " + class_name + "(" +
                              (struct_def.fields.vec.empty() ? "" : "\n");
    std::string unpack_to_func = "\nunpackTo(_o: " + class_name + "): void {" +
                                 +(struct_def.fields.vec.empty() ? "" : "\n");

    std::string constructor_func = "constructor(";
    constructor_func += (struct_def.fields.vec.empty() ? "" : "\n");

    const auto has_create =
        struct_def.fixed || CanCreateFactoryMethod(struct_def);

    std::string pack_func_prototype =
        "\npack(builder:flatbuffers.Builder): flatbuffers.Offset {\n";

    std::string pack_func_offset_decl;
    std::string pack_func_create_call;

    const auto struct_name = AddImport(imports, struct_def, struct_def).name;

    if (has_create) {
      pack_func_create_call = "  return " + struct_name + ".create" +
                              GetPrefixedName(struct_def) + "(builder" +
                              (struct_def.fields.vec.empty() ? "" : ",\n    ");
    } else {
      pack_func_create_call = "  " + struct_name + ".start" +
                              GetPrefixedName(struct_def) + "(builder);\n";
    }

    if (struct_def.fixed) {
      // when packing struct, nested struct's members instead of the struct's
      // offset are used
      pack_func_create_call +=
          GenStructMemberValueTS(struct_def, "this", ",\n    ", false) + "\n  ";
    }

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      const auto field_method = namer_.Method(field);
      const auto field_field = namer_.Field(field);
      const std::string field_binded_method =
          "this." + field_method + ".bind(this)";

      std::string field_val;
      std::string field_type;
      // a string that declares a variable containing the
      // offset for things that can't be generated inline
      // empty otw
      std::string field_offset_decl;
      // a string that contains values for things that can be created inline or
      // the variable name from field_offset_decl
      std::string field_offset_val;
      const auto field_default_val = GenDefaultValue(field, imports);

      // Emit a scalar field
      const auto is_string = IsString(field.value.type);
      if (IsScalar(field.value.type.base_type) || is_string) {
        const auto has_null_default = is_string || HasNullDefault(field);

        field_type += GenTypeName(imports, field, field.value.type, false,
                                  has_null_default);
        field_val = "this." + namer_.Method(field) + "()";

        if (field.value.type.base_type != BASE_TYPE_STRING) {
          field_offset_val = "this." + namer_.Field(field);
        } else {
          field_offset_decl = GenNullCheckConditional(
              "this." + namer_.Field(field),
              "builder.createString(this." + field_field + "!)", "0");
        }
      }

      // Emit an object field
      else {
        auto is_vector = false;
        switch (field.value.type.base_type) {
          case BASE_TYPE_STRUCT: {
            const auto &sd = *field.value.type.struct_def;
            field_type += AddImport(imports, struct_def, sd).object_name;

            const std::string field_accessor =
                "this." + namer_.Method(field) + "()";
            field_val = GenNullCheckConditional(field_accessor,
                                                field_accessor + "!.unpack()");
            auto packing = GenNullCheckConditional(
                "this." + field_field,
                "this." + field_field + "!.pack(builder)", "0");

            if (sd.fixed) {
              field_offset_val = std::move(packing);
            } else {
              field_offset_decl = std::move(packing);
            }

            break;
          }

          case BASE_TYPE_ARRAY: {
            auto vectortype = field.value.type.VectorType();
            auto vectortypename =
                GenTypeName(imports, struct_def, vectortype, false);
            is_vector = true;

            field_type = "(";

            switch (vectortype.base_type) {
              case BASE_TYPE_STRUCT: {
                const auto &sd = *field.value.type.struct_def;
                const auto field_type_name =
                    GetTypeName(sd, /*object_api=*/true);
                field_type += field_type_name;
                field_type += ")[]";

                field_val = GenBBAccess() + ".createObjList<" + vectortypename +
                            ", " + field_type_name + ">(" +
                            field_binded_method + ", " +
                            NumToString(field.value.type.fixed_length) + ")";

                if (sd.fixed) {
                  field_offset_decl =
                      "builder.createStructOffsetList(this." + field_field +
                      ", " + AddImport(imports, struct_def, struct_def).name +
                      "." + namer_.Method("start", field, "Vector") + ")";
                } else {
                  field_offset_decl =
                      AddImport(imports, struct_def, struct_def).name + "." +
                      namer_.Method("create", field, "Vector") +
                      "(builder, builder.createObjectOffsetList(" + "this." +
                      field_field + "))";
                }

                break;
              }

              case BASE_TYPE_STRING: {
                field_type += "string)[]";
                field_val = GenBBAccess() + ".createScalarList<string>(" +
                            field_binded_method + ", this." +
                            namer_.Field(field, "Length") + "())";
                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";
                break;
              }

              case BASE_TYPE_UNION: {
                field_type += GenObjApiUnionTypeTS(
                    imports, struct_def, parser.opts, *(vectortype.enum_def));
                field_type += ")[]";
                field_val = GenUnionValTS(imports, struct_def, field_method,
                                          vectortype, true);

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";

                break;
              }
              default: {
                if (vectortype.enum_def) {
                  field_type += GenTypeName(imports, struct_def, vectortype,
                                            false, HasNullDefault(field));
                } else {
                  field_type += vectortypename;
                }
                field_type += ")[]";
                field_val = GenBBAccess() + ".createScalarList<" +
                            vectortypename + ">(" + field_binded_method + ", " +
                            NumToString(field.value.type.fixed_length) + ")";

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, this." + field_field + ")";

                break;
              }
            }

            break;
          }

          case BASE_TYPE_VECTOR: {
            auto vectortype = field.value.type.VectorType();
            auto vectortypename =
                GenTypeName(imports, struct_def, vectortype, false);
            is_vector = true;

            field_type = "(";

            switch (vectortype.base_type) {
              case BASE_TYPE_STRUCT: {
                const auto &sd = *field.value.type.struct_def;
                const auto field_type_name =
                    GetTypeName(sd, /*object_api=*/true);
                field_type += field_type_name;
                field_type += ")[]";

                field_val = GenBBAccess() + ".createObjList<" + vectortypename +
                            ", " + field_type_name + ">(" +
                            field_binded_method + ", this." +
                            namer_.Method(field, "Length") + "())";

                if (sd.fixed) {
                  field_offset_decl =
                      "builder.createStructOffsetList(this." + field_field +
                      ", " + AddImport(imports, struct_def, struct_def).name +
                      "." + namer_.Method("start", field, "Vector") + ")";
                } else {
                  field_offset_decl =
                      AddImport(imports, struct_def, struct_def).name + "." +
                      namer_.Method("create", field, "Vector") +
                      "(builder, builder.createObjectOffsetList(" + "this." +
                      field_field + "))";
                }

                break;
              }

              case BASE_TYPE_STRING: {
                field_type += "string)[]";
                field_val = GenBBAccess() + ".createScalarList<string>(" +
                            field_binded_method + ", this." +
                            namer_.Field(field, "Length") + "())";
                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";
                break;
              }

              case BASE_TYPE_UNION: {
                field_type += GenObjApiUnionTypeTS(
                    imports, struct_def, parser.opts, *(vectortype.enum_def));
                field_type += ")[]";
                field_val = GenUnionValTS(imports, struct_def, field_method,
                                          vectortype, true);

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, builder.createObjectOffsetList(" + "this." +
                    namer_.Field(field) + "))";

                break;
              }
              default: {
                if (vectortype.enum_def) {
                  field_type += GenTypeName(imports, struct_def, vectortype,
                                            false, HasNullDefault(field));
                } else {
                  field_type += vectortypename;
                }
                field_type += ")[]";
                field_val = GenBBAccess() + ".createScalarList<" +
                            vectortypename + ">(" + field_binded_method +
                            ", this." + namer_.Method(field, "Length") + "())";

                field_offset_decl =
                    AddImport(imports, struct_def, struct_def).name + "." +
                    namer_.Method("create", field, "Vector") +
                    "(builder, this." + field_field + ")";

                break;
              }
            }

            break;
          }

          case BASE_TYPE_UNION: {
            field_type += GenObjApiUnionTypeTS(imports, struct_def, parser.opts,
                                               *(field.value.type.enum_def));

            field_val = GenUnionValTS(imports, struct_def, field_method,
                                      field.value.type);
            field_offset_decl =
                "builder.createObjectOffset(this." + field_field + ")";
            break;
          }

          default: FLATBUFFERS_ASSERT(0); break;
        }

        // length 0 vector is simply empty instead of null
        field_type += is_vector ? "" : "|null";
      }

      if (!field_offset_decl.empty()) {
        field_offset_decl =
            "  const " + field_field + " = " + field_offset_decl + ";";
      }
      if (field_offset_val.empty()) { field_offset_val = field_field; }

      unpack_func += "    " + field_val;
      unpack_to_func += "  _o." + field_field + " = " + field_val + ";";

      // FIXME: if field_type and field_field are identical, then
      // this generates invalid typescript.
      constructor_func += "  public " + field_field + ": " + field_type +
                          " = " + field_default_val;

      if (!struct_def.fixed) {
        if (!field_offset_decl.empty()) {
          pack_func_offset_decl += field_offset_decl + "\n";
        }

        if (has_create) {
          pack_func_create_call += field_offset_val;
        } else {
          if (field.IsScalarOptional()) {
            pack_func_create_call +=
                "  if (" + field_offset_val + " !== null)\n  ";
          }
          pack_func_create_call += "  " + struct_name + "." +
                                   namer_.Method("add", field) + "(builder, " +
                                   field_offset_val + ");\n";
        }
      }

      if (std::next(it) != struct_def.fields.vec.end()) {
        constructor_func += ",\n";

        if (!struct_def.fixed && has_create) {
          pack_func_create_call += ",\n    ";
        }

        unpack_func += ",\n";
        unpack_to_func += "\n";
      } else {
        constructor_func += "\n";
        if (!struct_def.fixed) {
          pack_func_offset_decl += (pack_func_offset_decl.empty() ? "" : "\n");
          pack_func_create_call += "\n  ";
        }

        unpack_func += "\n  ";
        unpack_to_func += "\n";
      }
    }

    constructor_func += "){}\n\n";

    if (has_create) {
      pack_func_create_call += ");";
    } else {
      pack_func_create_call += "return " + struct_name + ".end" +
                               GetPrefixedName(struct_def) + "(builder);";
    }
    obj_api_class = "\n";
    obj_api_class += "export class ";
    obj_api_class += GetTypeName(struct_def, /*object_api=*/true);
    obj_api_class += " implements flatbuffers.IGeneratedObject {\n";
    obj_api_class += constructor_func;
    obj_api_class += pack_func_prototype + pack_func_offset_decl +
                     pack_func_create_call + "\n}";

    obj_api_class += "\n}\n";

    unpack_func += ");\n}";
    unpack_to_func += "}\n";

    obj_api_unpack_func = unpack_func + "\n\n" + unpack_to_func;
  }